

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O0

void __thiscall
amrex::InterpBndryData::BndryValuesDoIt
          (InterpBndryData *this,BndryRegister *crse,int c_start,MultiFab *fine,int f_start,
          int bnd_start,int num_comp,IntVect *ratio,BCRec *bc,int max_order)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  BATType BVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  BaseFab<double> *this_00;
  int iVar16;
  long in_RCX;
  int in_EDX;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  Long *in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int ii;
  int jj;
  int kk;
  int nn;
  Dim3 amrex_i_hi_4;
  Dim3 amrex_i_lo_4;
  Box *b_1;
  Array4<const_double> src_array;
  Array4<double> bnd_array;
  FArrayBox *src_fab;
  FArrayBox *bnd_fab;
  int it_3;
  int jt_3;
  int kt_3;
  int n_4;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  int it_2;
  int jt_2;
  int kt_2;
  int n_3;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int it_1;
  int jt_1;
  int kt_1;
  int n_2;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int is_not_covered;
  Array4<int> mask_array;
  int it;
  int jt;
  int kt;
  int n_1;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Dim3 rr;
  Box *b;
  Array4<double> bdry_array;
  Array4<double> crse_array;
  Orientation face;
  Side side;
  int dir;
  int i;
  Box *fine_bx;
  MFIter mfi;
  MFItInfo info;
  MultiFab foo;
  Box *fine_domain;
  int n;
  int kc;
  int jc;
  int ic;
  Real z;
  Real y;
  Real dyz;
  Real dz2;
  Real dz;
  Real dy2;
  Real dy;
  Real fac;
  int hi;
  int lo;
  int kc_1;
  int jc_1;
  int ic_1;
  Real z_1;
  Real x;
  Real dxz;
  Real dz2_1;
  Real dz_1;
  Real dx2;
  Real dx;
  Real fac_1;
  int hi_1;
  int lo_1;
  int kc_2;
  int jc_2;
  int ic_2;
  Real y_1;
  Real x_1;
  Real dxy;
  Real dy2_1;
  Real dy_1;
  Real dx2_1;
  Real dx_1;
  Real fac_2;
  int hi_2;
  int lo_2;
  int kc_3;
  int jc_3;
  int ic_3;
  BndryRegister *this_01;
  undefined4 in_stack_ffffffffffffe650;
  Orientation in_stack_ffffffffffffe654;
  MFIter *in_stack_ffffffffffffe660;
  pointer in_stack_ffffffffffffe668;
  MFInfo *in_stack_ffffffffffffe670;
  FabArrayBase *in_stack_ffffffffffffe678;
  MFIter *in_stack_ffffffffffffe680;
  BoxArray *in_stack_ffffffffffffe688;
  undefined4 in_stack_ffffffffffffe690;
  undefined4 in_stack_ffffffffffffe694;
  void *local_1968;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffe6a0;
  double local_1958;
  int local_1950;
  int local_194c;
  uint local_1948;
  uint local_1944;
  uint local_1940;
  uint local_1938;
  uint local_1934;
  uint local_1930;
  int local_1928;
  int local_1924;
  int local_1920;
  element_type *local_18e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18e0;
  _Bit_type *local_18d0;
  uint local_18c8;
  uint local_18c4;
  pointer local_18c0;
  double local_18b0;
  uint local_18a8;
  uint local_18a4;
  uint local_18a0;
  uint local_189c;
  uint local_1898;
  uint local_1890;
  uint local_188c;
  uint local_1888;
  uint local_1880;
  uint local_187c;
  uint local_1878;
  double local_1840;
  double local_1838;
  _func_int **local_1828;
  BATType local_1820;
  BATType local_181c;
  PCData<amrex::FArrayBox> *local_1818;
  double local_1808;
  int local_1800;
  int local_17fc;
  BATType local_17f8;
  BATType local_17f4;
  BATType local_17f0;
  int local_17e8;
  int local_17e4;
  int local_17e0;
  uint local_17d8;
  uint local_17d4;
  uint local_17d0;
  int local_1788;
  int local_1784;
  int local_1780;
  int local_1778;
  int local_1774;
  int local_1770;
  int local_1768;
  int local_1764;
  int local_1760;
  int local_1724;
  int local_16e0;
  uint local_16dc;
  int local_16d8;
  int local_16d4;
  undefined1 local_1694 [36];
  Array4<const_double> local_1670;
  Array4<double> local_1630;
  BaseFab<double> *local_15f0;
  BaseFab<double> *local_15e8;
  Array4<const_int> local_15e0;
  long local_15a0;
  long local_1598;
  long local_1590;
  long local_1588;
  int local_1580;
  int local_157c;
  int local_1578;
  int local_1560;
  uint local_155c;
  uint local_1558;
  BATType local_1554;
  Long local_1550;
  int local_1548;
  undefined8 local_153c;
  int local_1534;
  pointer local_1530;
  uint local_1528;
  undefined8 local_1520;
  uint local_1518;
  Array4<const_int> local_1510;
  undefined1 local_14d0 [88];
  uint local_1478;
  undefined1 local_146c [20];
  uint local_1458;
  undefined8 local_1450;
  uint local_1448;
  Array4<const_int> local_1440;
  undefined1 local_1400 [208];
  Array4<const_double> local_1330;
  int local_12f0;
  int local_12ec;
  int local_12e8;
  int local_12e4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_12e0;
  int local_12d8;
  undefined8 local_12cc;
  int local_12c4;
  pointer local_12c0;
  int local_12b8;
  undefined8 local_12b0;
  int local_12a8;
  Long local_12a0;
  int local_1298;
  undefined8 local_128c;
  int local_1284;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_1280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1278;
  int local_1258;
  int local_1254;
  int local_1250;
  int local_1234;
  Array4<double> local_1230;
  int local_11ec;
  int local_11e8;
  Orientation local_11e4;
  Side local_11e0;
  int local_11dc;
  int local_11d8;
  undefined1 local_11d4 [28];
  undefined1 *local_11b8;
  MFIter local_11b0;
  MFItInfo local_1150;
  undefined1 local_1130 [16];
  BATransformer aBStack_1120 [6];
  undefined4 local_f70;
  undefined4 local_f6c;
  undefined8 local_f68;
  undefined4 local_f5c;
  BaseFab<double> *local_f48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f40;
  element_type *local_f38;
  int local_f30;
  pointer local_f28;
  int local_f1c;
  uint uStack_f18;
  int local_f14;
  pointer local_f10;
  uint local_f08;
  PCData<amrex::FArrayBox> *local_f00;
  int local_ef4;
  int iStack_ef0;
  uint local_eec;
  pointer local_ee8;
  uint local_ee0;
  RefID local_ed8;
  int local_ecc;
  int iStack_ec8;
  uint local_ec4;
  element_type *local_ec0;
  BATType local_eb8;
  DataAllocator local_eb0;
  int local_ea4;
  int iStack_ea0;
  BATType local_e9c;
  pointer local_e98;
  int local_e90;
  PCData<amrex::FArrayBox> *local_e88;
  int local_e7c;
  int iStack_e78;
  int local_e74;
  pointer local_e70;
  int local_e68;
  pointer local_e60;
  int local_e54;
  int iStack_e50;
  int local_e4c;
  Long local_e48;
  int local_e40;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_e38;
  undefined4 local_e2c;
  undefined4 uStack_e28;
  int local_e24;
  BATransformer local_e20;
  undefined4 uStack_dd8;
  int local_dd4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_dd0;
  int local_dc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_dc0;
  undefined4 local_db4;
  undefined4 uStack_db0;
  int local_dac;
  int local_da8;
  int local_da4;
  uint local_da0;
  int local_d9c;
  Array4<const_double> *local_d98;
  int local_d90;
  int local_d8c;
  uint local_d88;
  int local_d84;
  Array4<double> *local_d80;
  Long local_d78;
  int local_d70;
  int local_d60;
  int iStack_d5c;
  int local_d58;
  int local_d54;
  int local_d50;
  int local_d4c;
  undefined8 *local_d48;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d28;
  int local_d20;
  int local_d1c;
  int local_d18;
  int local_d14;
  int local_d10;
  int local_d0c;
  int local_d08;
  int local_d04;
  MultiArray4<double> local_d00;
  int local_cf8;
  int local_cf4;
  int local_cf0;
  int local_cec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ce8;
  pointer local_ce0;
  double local_cd8;
  double local_cd0;
  double local_cc8;
  unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_cc0;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_cb8;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_cb0;
  _func_int **local_ca8;
  BATType local_ca0;
  BATOp local_c9c;
  int local_c58;
  BATType local_c54;
  int local_c50;
  uint local_c4c;
  int local_c48;
  BATType local_c44;
  int local_c40;
  uint local_c3c;
  FabArray<amrex::FArrayBox> *local_c38;
  int local_c30;
  int local_c2c;
  int local_c28;
  uint local_c24;
  FabArray<amrex::FArrayBox> *local_c20;
  int local_c18;
  int local_c14;
  int local_c10;
  uint local_c0c;
  FabArray<amrex::FArrayBox> *local_c08;
  int local_c00;
  int local_bfc;
  uint local_bf8;
  uint local_bf4;
  FabArray<amrex::FArrayBox> *local_bf0;
  int local_be8;
  int local_be4;
  int local_be0;
  uint local_bdc;
  RefID local_bd8;
  int local_bd0;
  int local_bcc;
  int local_bc8;
  uint local_bc4;
  FabArray<amrex::FArrayBox> *local_bc0;
  int local_bb8;
  BATType local_bb4;
  int local_bb0;
  uint local_bac;
  FabArray<amrex::FArrayBox> *local_ba8;
  int local_ba0;
  int local_b9c;
  int local_b98;
  uint local_b94;
  FabArray<amrex::FArrayBox> *local_b90;
  int local_b88;
  BATType local_b84;
  int local_b80;
  uint local_b7c;
  MultiArray4<const_double> local_b78;
  int local_b70;
  BATType local_b6c;
  int local_b68;
  uint local_b64;
  FabArray<amrex::FArrayBox> *local_b60;
  int local_b58;
  BATType local_b54;
  int local_b50;
  uint local_b4c;
  FabArray<amrex::FArrayBox> *local_b48;
  int local_b40;
  BATType local_b3c;
  int local_b38;
  uint local_b34;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> local_b30;
  int local_b28;
  BATType local_b24;
  BATType local_b20;
  BATOp local_b1c;
  int local_ad8;
  uint local_ad4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad0;
  element_type *local_ac8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ac0;
  element_type *local_ab8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ab0;
  pointer local_aa8;
  pointer local_aa0;
  pointer local_a98;
  _Bit_type *local_a90;
  uint local_a88;
  uint local_a84;
  uint local_a80;
  uint local_a7c;
  uint local_a78;
  int local_a74;
  Array4<const_int> *local_a70;
  undefined8 *local_a68;
  RefID local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a48;
  int local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a34;
  int local_a30;
  uint local_a2c;
  uint local_a28;
  uint local_a24;
  FBData<amrex::FArrayBox> *local_a20;
  int local_a18;
  int local_a14;
  uint local_a10;
  int local_a0c;
  FBData<amrex::FArrayBox> *local_a08;
  int local_a00;
  int local_9fc;
  uint local_9f8;
  int local_9f4;
  FBData<amrex::FArrayBox> *local_9f0;
  int local_9e8;
  int local_9e4;
  uint local_9e0;
  int local_9dc;
  FBData<amrex::FArrayBox> *local_9d8;
  int local_9d0;
  int local_9cc;
  uint local_9c8;
  int local_9c4;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> local_9c0;
  int local_9b8;
  int local_9b4;
  uint local_9b0;
  uint local_9ac;
  FBData<amrex::FArrayBox> *local_9a8;
  BATType local_9a0;
  BATOp local_99c;
  int local_958;
  uint local_954;
  uint local_950;
  uint local_94c;
  FBData<amrex::FArrayBox> *local_948;
  int local_940;
  uint local_93c;
  uint local_938;
  int local_934;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_930;
  int local_928;
  uint local_924;
  uint local_920;
  uint local_91c;
  FBData<amrex::FArrayBox> *local_918;
  int local_910;
  uint local_90c;
  uint local_908;
  int local_904;
  FBData<amrex::FArrayBox> *local_900;
  uint local_8f8;
  uint local_8f4;
  uint local_8f0;
  uint local_8ec;
  FBData<amrex::FArrayBox> *local_8e8;
  int local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  RefID local_8d0;
  int local_8c8;
  uint local_8c4;
  uint local_8c0;
  uint local_8bc;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_8b8;
  DataAllocator local_8b0;
  double local_8a8;
  pointer local_8a0;
  pointer local_898;
  pointer local_890;
  void *local_888;
  MultiArray4<double> local_880;
  MultiArray4<const_double> local_878;
  uint local_870;
  uint local_86c;
  uint local_868;
  uint local_864;
  int local_860;
  int local_85c;
  Array4<const_int> *local_858;
  undefined8 *local_850;
  unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_840;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_830;
  BATType local_828;
  BATOp local_824;
  int local_7e0;
  int local_7dc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7d8;
  int local_7d0;
  uint local_7cc;
  int local_7c8;
  int local_7c4;
  FBData<amrex::FArrayBox> *local_7c0;
  int local_7b8;
  uint local_7b4;
  int local_7b0;
  int local_7ac;
  FBData<amrex::FArrayBox> *local_7a8;
  int local_7a0;
  uint local_79c;
  int local_798;
  int local_794;
  FBData<amrex::FArrayBox> *local_790;
  int local_788;
  uint local_784;
  uint local_780;
  int local_77c;
  FBData<amrex::FArrayBox> *local_778;
  int local_770;
  uint local_76c;
  int local_768;
  int local_764;
  FBData<amrex::FArrayBox> *local_760;
  int local_758;
  uint local_754;
  uint local_750;
  int local_74c;
  FBData<amrex::FArrayBox> *local_748;
  int local_740;
  uint local_73c;
  uint local_738;
  int local_734;
  FBData<amrex::FArrayBox> *local_730;
  int local_728;
  uint local_724;
  uint local_720;
  int local_71c;
  FBData<amrex::FArrayBox> *local_718;
  int local_710;
  uint local_70c;
  uint local_708;
  int local_704;
  FBData<amrex::FArrayBox> *local_700;
  int local_6f8;
  uint local_6f4;
  uint local_6f0;
  int local_6ec;
  FBData<amrex::FArrayBox> *local_6e8;
  int local_6e0;
  uint local_6dc;
  uint local_6d8;
  int local_6d4;
  FBData<amrex::FArrayBox> *local_6d0;
  int local_6c8;
  uint local_6c4;
  uint local_6c0;
  int local_6bc;
  FBData<amrex::FArrayBox> *local_6b8;
  int local_6b0;
  uint local_6ac;
  uint local_6a8;
  int local_6a4;
  FabArray<amrex::FArrayBox> *local_6a0;
  char *local_698;
  undefined4 local_68c;
  undefined1 *local_688;
  undefined4 local_67c;
  undefined1 *local_678;
  undefined4 local_66c;
  undefined8 *local_668;
  undefined4 local_65c;
  undefined1 *local_658;
  undefined4 local_64c;
  undefined1 *local_648;
  undefined4 local_63c;
  int *local_638;
  undefined4 local_62c;
  undefined1 *local_628;
  undefined4 local_61c;
  undefined1 *local_618;
  undefined4 local_60c;
  int *local_608;
  undefined4 local_5fc;
  undefined1 *local_5f8;
  undefined4 local_5ec;
  undefined1 *local_5e8;
  undefined4 local_5dc;
  Long *local_5d8;
  undefined4 local_5cc;
  undefined1 *local_5c8;
  undefined4 local_5bc;
  undefined1 *local_5b8;
  undefined4 local_5ac;
  int *local_5a8;
  undefined4 local_59c;
  PCData<amrex::FArrayBox> *local_598;
  undefined4 local_58c;
  PCData<amrex::FArrayBox> *local_588;
  undefined4 local_57c;
  PCData<amrex::FArrayBox> *local_578;
  undefined4 local_56c;
  PCData<amrex::FArrayBox> *local_568;
  undefined4 local_55c;
  PCData<amrex::FArrayBox> *local_558;
  undefined4 local_54c;
  PCData<amrex::FArrayBox> *local_548;
  undefined4 local_53c;
  PCData<amrex::FArrayBox> *local_538;
  undefined4 local_52c;
  PCData<amrex::FArrayBox> *local_528;
  undefined4 local_51c;
  PCData<amrex::FArrayBox> *local_518;
  undefined4 local_50c;
  PCData<amrex::FArrayBox> *local_508;
  undefined4 local_4fc;
  PCData<amrex::FArrayBox> *local_4f8;
  undefined4 local_4ec;
  PCData<amrex::FArrayBox> *local_4e8;
  undefined4 local_4dc;
  pointer local_4d8;
  undefined4 local_4cc;
  pointer local_4c8;
  undefined4 local_4bc;
  pointer local_4b8;
  int local_4ac;
  uint local_4a8;
  uint local_4a4;
  int local_4a0;
  uint local_49c;
  uint local_498;
  uint local_494;
  int local_490;
  int local_48c;
  int local_488;
  uint local_484;
  uint local_480;
  int local_47c;
  uint local_478;
  IndexType local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  int local_464;
  BATType local_460;
  BATType local_45c;
  int local_458;
  int local_454;
  int local_450;
  uint local_44c;
  uint local_448;
  uint local_444;
  int local_440;
  int local_43c;
  int local_438;
  int local_434;
  int local_430;
  int local_42c;
  uint local_428;
  int local_424;
  int local_420;
  uint local_41c;
  int local_418;
  int local_414;
  Array4<const_int> *local_410;
  uint local_404;
  int local_400;
  int local_3fc;
  Array4<const_int> *local_3f8;
  uint local_3ec;
  int local_3e8;
  int local_3e4;
  Array4<const_int> *local_3e0;
  uint local_3d4;
  int local_3d0;
  int local_3cc;
  Array4<const_int> *local_3c8;
  uint local_3bc;
  int local_3b8;
  int local_3b4;
  Array4<const_int> *local_3b0;
  uint local_3a4;
  int local_3a0;
  int local_39c;
  Array4<const_int> *local_398;
  uint local_38c;
  uint local_388;
  int local_384;
  Array4<const_int> *local_380;
  uint local_374;
  uint local_370;
  int local_36c;
  Array4<const_int> *local_368;
  int local_35c;
  uint local_358;
  int local_354;
  Array4<const_int> *local_350;
  int local_344;
  uint local_340;
  int local_33c;
  Array4<const_int> *local_338;
  int local_32c;
  uint local_328;
  int local_324;
  Array4<const_int> *local_320;
  int local_314;
  uint local_310;
  int local_30c;
  Array4<const_int> *local_308;
  int local_2fc;
  uint local_2f8;
  uint local_2f4;
  Array4<const_int> *local_2f0;
  int local_2e4;
  uint local_2e0;
  uint local_2dc;
  Array4<const_int> *local_2d8;
  uint local_2cc;
  uint local_2c8;
  int local_2c4;
  Array4<const_int> *local_2c0;
  uint local_2b4;
  uint local_2b0;
  int local_2ac;
  Array4<const_int> *local_2a8;
  int local_29c;
  int local_298;
  uint local_294;
  Array4<const_int> *local_290;
  int local_284;
  int local_280;
  uint local_27c;
  Array4<const_int> *local_278;
  int local_26c;
  int local_268;
  uint local_264;
  Array4<const_int> *local_260;
  int local_254;
  int local_250;
  uint local_24c;
  Array4<const_int> *local_248;
  int local_23c;
  int local_238;
  uint local_234;
  Array4<const_int> *local_230;
  int local_224;
  int local_220;
  uint local_21c;
  Array4<const_int> *local_218;
  BATType local_20c;
  int local_208;
  uint local_204;
  Array4<const_int> *local_200;
  BATType local_1f4;
  int local_1f0;
  uint local_1ec;
  Array4<const_int> *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  iVar14 = in_R9D;
  local_f70 = in_R9D;
  local_f6c = in_R8D;
  local_f68 = in_RCX;
  local_f5c = in_EDX;
  if (in_stack_00000018 != 0) {
    while (aBStack_1120[5].m_op.m_bndryReg.m_doihi.vect[2] = iVar14,
          (int)aBStack_1120[5].m_op._64_4_ < local_f70 + in_stack_00000008) {
      (**(code **)(*in_RDI + 0x18))
                (in_RDI,in_stack_00000018,in_stack_00000010,
                 aBStack_1120[5].m_op.m_bndryReg.m_doihi.vect[2]);
      iVar14 = aBStack_1120[5].m_op.m_bndryReg.m_doihi.vect[2] + 1;
    }
  }
  aBStack_1120[5].m_op._52_8_ = Geometry::Domain((Geometry *)(in_RDI + 0x175));
  if ((in_stack_00000020 == 3) || (in_stack_00000020 == 1)) {
    FabSet::DistributionMap((FabSet *)0x18cd366);
    aBStack_1120[0].m_op._4_8_ = 0;
    aBStack_1120[0].m_op._12_8_ = 0;
    local_1130._8_8_ = (_func_int **)0x0;
    aBStack_1120[0]._0_8_ = 0;
    aBStack_1120[0].m_op._20_8_ = 0;
    MFInfo::MFInfo((MFInfo *)0x18cd3a2);
    MFInfo::SetAlloc((MFInfo *)(local_1130 + 8),false);
    local_1130._0_8_ = (_func_int **)0x0;
    this_01 = (BndryRegister *)local_1130;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650));
    MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),
                       in_stack_ffffffffffffe688,(DistributionMapping *)in_stack_ffffffffffffe680,
                       (int)((ulong)in_stack_ffffffffffffe678 >> 0x20),
                       (int)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670,
                       in_stack_ffffffffffffe6a0);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x18cd430);
    MFInfo::~MFInfo((MFInfo *)0x18cd43d);
    MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffe660);
    MFItInfo::SetDynamic(&local_1150,true);
    MFIter::MFIter(in_stack_ffffffffffffe680,in_stack_ffffffffffffe678,
                   (MFItInfo *)in_stack_ffffffffffffe670);
    while (bVar13 = MFIter::isValid(&local_11b0), bVar13) {
      MFIter::validbox(in_stack_ffffffffffffe660);
      local_11b8 = local_11d4;
      for (local_11d8 = 0; local_11d8 < 6; local_11d8 = local_11d8 + 1) {
        if (local_11d8 < 3) {
          local_1724 = local_11d8;
        }
        else {
          local_1724 = local_11d8 + -3;
        }
        local_11dc = local_1724;
        local_11e0 = (Side)(2 < local_11d8);
        Orientation::Orientation(&local_11e4,local_1724,local_11e0);
        local_11e8 = local_11e4.val;
        iVar14 = Box::operator[]((Box *)in_stack_ffffffffffffe660,
                                 (Orientation)(int)in_stack_ffffffffffffe668);
        local_11ec = local_11e4.val;
        iVar15 = Box::operator[]((Box *)in_stack_ffffffffffffe660,
                                 (Orientation)(int)in_stack_ffffffffffffe668);
        if ((iVar14 != iVar15) ||
           (bVar13 = Geometry::isPeriodic((Geometry *)(in_RDI + 0x175),local_11dc), bVar13)) {
          local_1234 = local_11e4.val;
          BndryRegister::operator[](this_01,in_stack_ffffffffffffe654);
          FabSet::array((FabSet *)CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650),
                        (MFIter *)this_01);
          Orientation::operator_cast_to_int(&local_11e4);
          FabSet::array((FabSet *)CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650),
                        (MFIter *)this_01);
          Orientation::operator_cast_to_int(&local_11e4);
          this_00 = &FabSet::operator[]((FabSet *)
                                        CONCAT44(in_stack_ffffffffffffe654.val,
                                                 in_stack_ffffffffffffe650),(MFIter *)this_01)->
                     super_BaseFab<double>;
          local_1280._M_head_impl = (PCData<amrex::FArrayBox> *)BaseFab<double>::box(this_00);
          local_d60 = (int)*in_stack_00000010;
          iStack_d5c = *(int *)((long)in_stack_00000010 + 4);
          local_12a0 = *in_stack_00000010;
          local_1298 = (int)in_stack_00000010[1];
          local_128c = local_12a0;
          local_1284 = local_1298;
          local_d78 = local_12a0;
          local_d70 = local_1298;
          local_d58 = local_1298;
          if (in_stack_00000020 == 1) {
            local_57c = 0;
            local_e7c = *(int *)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  &(local_1280._M_head_impl)->cpc)->
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start;
            local_58c = 1;
            iStack_e78 = *(int *)((long)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                          &(local_1280._M_head_impl)->cpc)->
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4);
            local_12c0 = (pointer)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                   &(local_1280._M_head_impl)->cpc)->
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
            local_59c = 2;
            local_12b8 = *(int *)&(local_1280._M_head_impl)->src;
            local_668 = (undefined8 *)((long)&(local_1280._M_head_impl)->src + 4);
            local_66c = 0;
            local_db4 = *(undefined4 *)local_668;
            local_678 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
            local_67c = 1;
            uStack_db0 = (local_1280._M_head_impl)->op;
            local_12e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_668;
            local_688 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
            local_68c = 2;
            local_12d8 = (local_1280._M_head_impl)->tag;
            local_12cc = local_12e0;
            local_12c4 = local_12d8;
            local_12b0 = local_12c0;
            local_12a8 = local_12b8;
            local_e98 = local_12c0;
            local_e90 = local_12b8;
            local_e88 = local_1280._M_head_impl;
            local_e74 = local_12b8;
            local_dd0._M_pi = local_12e0;
            local_dc8 = local_12d8;
            local_dc0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280._M_head_impl;
            local_dac = local_12d8;
            local_598 = local_1280._M_head_impl;
            local_588 = local_1280._M_head_impl;
            local_578 = local_1280._M_head_impl;
            for (local_12e4 = 0; local_12e4 < in_stack_00000008; local_12e4 = local_12e4 + 1) {
              for (local_12e8 = local_12a8; local_12e8 <= local_12c4; local_12e8 = local_12e8 + 1) {
                for (local_12ec = local_12b0._4_4_; local_12ec <= local_12cc._4_4_;
                    local_12ec = local_12ec + 1) {
                  for (local_12f0 = (int)local_12b0; uVar5 = local_f70, iVar10 = local_12e4,
                      iVar9 = local_12e8, iVar15 = local_12ec, iVar14 = local_12f0,
                      local_12f0 <= (int)local_12cc; local_12f0 = local_12f0 + 1) {
                    Array4<const_double>::Array4<const_double,_0>(&local_1330,&local_1230);
                    local_d14 = iVar14;
                    local_d18 = iVar15;
                    local_d1c = iVar9;
                    local_d20 = iVar10;
                    local_d28 = &local_1278;
                    local_d48 = &local_128c;
                    local_424 = iVar14;
                    local_428 = (uint)local_128c;
                    if ((uint)local_128c == 1) {
                      local_420 = iVar14;
                    }
                    else if ((uint)local_128c == 2) {
                      if (iVar14 < 0) {
                        iVar16 = iVar14 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1760 = -iVar16 / 2 + -1;
                      }
                      else {
                        local_1760 = iVar14 / 2;
                      }
                      local_420 = local_1760;
                    }
                    else if ((uint)local_128c == 4) {
                      if (iVar14 < 0) {
                        iVar16 = iVar14 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1764 = -iVar16 / 4 + -1;
                      }
                      else {
                        local_1764 = iVar14 / 4;
                      }
                      local_420 = local_1764;
                    }
                    else {
                      if (iVar14 < 0) {
                        iVar16 = iVar14 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1768 = -iVar16 / (int)(uint)local_128c + -1;
                      }
                      else {
                        local_1768 = iVar14 / (int)(uint)local_128c;
                      }
                      local_420 = local_1768;
                    }
                    local_d4c = local_420;
                    local_430 = iVar15;
                    local_434 = local_128c._4_4_;
                    if (local_128c._4_4_ == 1) {
                      local_42c = iVar15;
                    }
                    else if (local_128c._4_4_ == 2) {
                      if (iVar15 < 0) {
                        iVar16 = iVar15 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1770 = -iVar16 / 2 + -1;
                      }
                      else {
                        local_1770 = iVar15 / 2;
                      }
                      local_42c = local_1770;
                    }
                    else if (local_128c._4_4_ == 4) {
                      if (iVar15 < 0) {
                        iVar16 = iVar15 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1774 = -iVar16 / 4 + -1;
                      }
                      else {
                        local_1774 = iVar15 / 4;
                      }
                      local_42c = local_1774;
                    }
                    else {
                      if (iVar15 < 0) {
                        iVar16 = iVar15 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1778 = -iVar16 / local_128c._4_4_ + -1;
                      }
                      else {
                        local_1778 = iVar15 / local_128c._4_4_;
                      }
                      local_42c = local_1778;
                    }
                    local_d50 = local_42c;
                    local_43c = iVar9;
                    local_440 = local_1284;
                    if (local_1284 == 1) {
                      local_438 = iVar9;
                    }
                    else if (local_1284 == 2) {
                      if (iVar9 < 0) {
                        iVar16 = iVar9 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1780 = -iVar16 / 2 + -1;
                      }
                      else {
                        local_1780 = iVar9 / 2;
                      }
                      local_438 = local_1780;
                    }
                    else if (local_1284 == 4) {
                      if (iVar9 < 0) {
                        iVar16 = iVar9 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1784 = -iVar16 / 4 + -1;
                      }
                      else {
                        local_1784 = iVar9 / 4;
                      }
                      local_438 = local_1784;
                    }
                    else {
                      if (iVar9 < 0) {
                        iVar16 = iVar9 + 1;
                        if (iVar16 < 1) {
                          iVar16 = -iVar16;
                        }
                        local_1788 = -iVar16 / local_1284 + -1;
                      }
                      else {
                        local_1788 = iVar9 / local_1284;
                      }
                      local_438 = local_1788;
                    }
                    local_d54 = local_438;
                    local_d04 = local_420;
                    local_d08 = local_42c;
                    local_d0c = local_438;
                    local_d10 = iVar10 + local_f5c;
                    local_cec = iVar14;
                    local_cf0 = iVar15;
                    local_cf4 = iVar9;
                    local_cf8 = iVar10 + uVar5;
                    *(undefined8 *)
                     (local_1278._0_8_ +
                     ((long)(iVar14 - local_1258) +
                      (long)(iVar15 - local_1254) * local_1278._M_string_length +
                      (long)(iVar9 - local_1250) * local_1278.field_2._M_allocated_capacity +
                     (long)local_cf8 * local_1278.field_2._8_8_) * 8) =
                         *(undefined8 *)
                          ((long)(&((Box *)((long)local_1330.p + 0x18))->smallend + -2) +
                          ((long)(local_420 - local_1330.begin.x) +
                           (local_42c - local_1330.begin.y) * local_1330.jstride +
                           (local_438 - local_1330.begin.z) * local_1330.kstride +
                          local_d10 * local_1330.nstride) * 8);
                    local_d38._M_head_impl = (FabFactory<amrex::FArrayBox> *)&local_1330;
                    local_d00.hp = (Array4<double> *)&local_1330;
                    local_ce8 = local_d28;
                  }
                }
              }
            }
          }
          else {
            Orientation::operator_cast_to_int(&local_11e4);
            Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::operator[]
                      ((Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)
                       CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650),
                       (size_type)this_01);
            MultiMask::array((MultiMask *)
                             CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650),
                             (MFIter *)this_01);
            local_1400._140_4_ = 1;
            if (local_11dc == 0) {
              local_eb0.m_arena = (Arena *)local_1280._M_head_impl;
              local_548 = local_1280._M_head_impl;
              local_54c = 0;
              local_ea4 = *(int *)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                    &(local_1280._M_head_impl)->cpc)->
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
              local_558 = local_1280._M_head_impl;
              local_55c = 1;
              iStack_ea0 = *(int *)((long)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                            &(local_1280._M_head_impl)->cpc)->
                                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4);
              local_1400._112_8_ =
                   (((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                    &(local_1280._M_head_impl)->cpc)->
                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_568 = local_1280._M_head_impl;
              local_56c = 2;
              local_1400._120_4_ = *(undefined4 *)&(local_1280._M_head_impl)->src;
              local_e20.m_op._52_8_ = local_1280._M_head_impl;
              local_638 = (int *)((long)&(local_1280._M_head_impl)->src + 4);
              local_63c = 0;
              local_e20.m_op.m_bndryReg.m_doihi.vect[2] = *local_638;
              local_648 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
              local_64c = 1;
              uStack_dd8 = (local_1280._M_head_impl)->op;
              local_1400._80_8_ = *(undefined8 *)local_638;
              local_658 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
              local_65c = 2;
              local_1400._88_4_ = (local_1280._M_head_impl)->tag;
              local_1400._100_8_ = local_1400._80_8_;
              local_1400._108_4_ = local_1400._88_4_;
              local_1400._128_8_ = local_1400._112_8_;
              local_1400._136_4_ = local_1400._120_4_;
              local_ec0 = (element_type *)local_1400._112_8_;
              local_eb8 = local_1400._120_4_;
              local_e9c = local_1400._120_4_;
              local_e20.m_op._36_8_ = local_1400._80_8_;
              local_e20.m_op.m_bndryReg.m_doilo.vect[0] = local_1400._88_4_;
              local_dd4 = local_1400._88_4_;
              for (local_1400._76_4_ = 0; (int)local_1400._76_4_ < in_stack_00000008;
                  local_1400._76_4_ = local_1400._76_4_ + 1) {
                for (local_1400._72_4_ = local_1400._136_4_;
                    (int)local_1400._72_4_ <= (int)local_1400._108_4_;
                    local_1400._72_4_ = local_1400._72_4_ + indexType) {
                  for (local_1400._68_4_ = local_1400._132_4_;
                      (int)local_1400._68_4_ <= (int)local_1400._104_4_;
                      local_1400._68_4_ = local_1400._68_4_ + 1) {
                    for (local_1400._64_4_ = local_1400._128_4_; uVar11 = local_f70,
                        uVar8 = local_1400._76_4_, uVar7 = local_1400._72_4_,
                        uVar6 = local_1400._68_4_, uVar5 = local_1400._64_4_,
                        (int)local_1400._64_4_ <= (int)local_1400._100_4_;
                        local_1400._64_4_ = local_1400._64_4_ + 1) {
                      Array4<const_double>::Array4<const_double,_0>
                                ((Array4<const_double> *)local_1400,&local_1230);
                      uVar12 = local_f5c;
                      Array4<const_int>::Array4<const_int,_0>
                                (&local_1440,(Array4<int> *)(local_1400 + 0x90));
                      local_c4c = uVar5;
                      local_c50 = uVar6;
                      local_c54 = uVar7;
                      local_c58 = uVar8;
                      local_c9c.m_bndryReg.m_crse_ratio.vect[2] = local_1400._140_4_;
                      local_c9c._60_8_ = &local_1278;
                      local_c9c._28_8_ = &local_128c;
                      local_448 = uVar5;
                      local_44c = (uint)local_128c;
                      if ((uint)local_128c == 1) {
                        local_444 = uVar5;
                      }
                      else if ((uint)local_128c == 2) {
                        if ((int)uVar5 < 0) {
                          iVar14 = uVar5 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17d0 = -iVar14 / 2 - 1;
                        }
                        else {
                          local_17d0 = (int)uVar5 / 2;
                        }
                        local_444 = local_17d0;
                      }
                      else if ((uint)local_128c == 4) {
                        if ((int)uVar5 < 0) {
                          iVar14 = uVar5 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17d4 = -iVar14 / 4 - 1;
                        }
                        else {
                          local_17d4 = (int)uVar5 / 4;
                        }
                        local_444 = local_17d4;
                      }
                      else {
                        if ((int)uVar5 < 0) {
                          iVar14 = uVar5 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17d8 = -iVar14 / (int)(uint)local_128c - 1;
                        }
                        else {
                          local_17d8 = (int)uVar5 / (int)(uint)local_128c;
                        }
                        local_444 = local_17d8;
                      }
                      local_c9c.m_bndryReg.m_crse_ratio.vect[1] = local_444;
                      local_454 = uVar6;
                      local_458 = local_128c._4_4_;
                      if (local_128c._4_4_ == 1) {
                        local_450 = uVar6;
                      }
                      else if (local_128c._4_4_ == 2) {
                        if ((int)uVar6 < 0) {
                          iVar14 = uVar6 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17e0 = -iVar14 / 2 + -1;
                        }
                        else {
                          local_17e0 = (int)uVar6 / 2;
                        }
                        local_450 = local_17e0;
                      }
                      else if (local_128c._4_4_ == 4) {
                        if ((int)uVar6 < 0) {
                          iVar14 = uVar6 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17e4 = -iVar14 / 4 + -1;
                        }
                        else {
                          local_17e4 = (int)uVar6 / 4;
                        }
                        local_450 = local_17e4;
                      }
                      else {
                        if ((int)uVar6 < 0) {
                          iVar14 = uVar6 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17e8 = -iVar14 / local_128c._4_4_ + -1;
                        }
                        else {
                          local_17e8 = (int)uVar6 / local_128c._4_4_;
                        }
                        local_450 = local_17e8;
                      }
                      local_c9c.m_bndryReg.m_crse_ratio.vect[0] = local_450;
                      local_460 = uVar7;
                      local_464 = local_1284;
                      if (local_1284 == 1) {
                        local_45c = uVar7;
                      }
                      else if (local_1284 == 2) {
                        if ((int)uVar7 < 0) {
                          iVar14 = uVar7 + indexType;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17f0 = -iVar14 / 2 - indexType;
                        }
                        else {
                          local_17f0 = (int)uVar7 / 2;
                        }
                        local_45c = local_17f0;
                      }
                      else if (local_1284 == 4) {
                        if ((int)uVar7 < 0) {
                          iVar14 = uVar7 + indexType;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17f4 = -iVar14 / 4 - indexType;
                        }
                        else {
                          local_17f4 = (int)uVar7 / 4;
                        }
                        local_45c = local_17f4;
                      }
                      else {
                        if ((int)uVar7 < 0) {
                          iVar14 = uVar7 + indexType;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_17f8 = -iVar14 / local_1284 - indexType;
                        }
                        else {
                          local_17f8 = (int)uVar7 / local_1284;
                        }
                        local_45c = local_17f8;
                      }
                      local_c9c.m_bndryReg.m_typ.itype = (IndexType)local_45c;
                      local_1ec = uVar5;
                      local_1f0 = uVar6 - local_128c._4_4_;
                      local_1f4 = uVar7;
                      if (local_1440.p
                          [(long)(uVar5 - local_1440.begin.x) +
                           (local_1f0 - local_1440.begin.y) * local_1440.jstride +
                           (uVar7 - local_1440.begin.z) * local_1440.kstride] == local_1400._140_4_)
                      {
                        local_17fc = local_450 + -1;
                      }
                      else {
                        local_17fc = local_450;
                      }
                      local_204 = uVar5;
                      local_208 = uVar6 + local_128c._4_4_;
                      local_20c = uVar7;
                      if (local_1440.p
                          [(long)(uVar5 - local_1440.begin.x) +
                           (local_208 - local_1440.begin.y) * local_1440.jstride +
                           (uVar7 - local_1440.begin.z) * local_1440.kstride] == local_1400._140_4_)
                      {
                        local_1800 = local_450 + 1;
                      }
                      else {
                        local_1800 = local_450;
                      }
                      local_1808 = 1.0;
                      if (local_1800 != local_17fc + 1) {
                        local_1808 = 0.5;
                      }
                      local_b1c.m_bndryReg.m_doilo.vect[1] = local_444;
                      local_b1c.m_bndryReg.m_doilo.vect[0] = local_1800;
                      local_b1c.m_bndryReg.m_hishft.vect[2] = local_45c;
                      local_b1c.m_bndryReg.m_hishft.vect[1] = uVar8 + uVar12;
                      local_b1c.m_bndryReg.m_loshft.vect[1] = local_444;
                      local_b1c.m_bndryReg.m_loshft.vect[0] = local_17fc;
                      local_b1c.m_bndryReg.m_crse_ratio.vect[2] = local_45c;
                      local_b1c.m_bndryReg.m_crse_ratio.vect[1] = uVar8 + uVar12;
                      local_cb0._M_t.
                      super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>.
                      _M_head_impl = (__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
                                      )(local_1808 *
                                       ((double)*(_func_int **)
                                                 (local_1400._0_8_ +
                                                 ((long)(int)(local_444 - local_1400._32_4_) +
                                                  (long)(local_1800 - local_1400._36_4_) *
                                                  local_1400._8_8_ +
                                                  (long)(int)(local_45c - local_1400._40_4_) *
                                                  local_1400._16_8_ +
                                                 (long)local_b1c.m_bndryReg.m_hishft.vect[1] *
                                                 local_1400._24_8_) * 8) -
                                       (double)*(_func_int **)
                                                (local_1400._0_8_ +
                                                ((long)(int)(local_444 - local_1400._32_4_) +
                                                 (long)(local_17fc - local_1400._36_4_) *
                                                 local_1400._8_8_ +
                                                 (long)(int)(local_45c - local_1400._40_4_) *
                                                 local_1400._16_8_ +
                                                (long)local_b1c.m_bndryReg.m_crse_ratio.vect[1] *
                                                local_1400._24_8_) * 8)));
                      if (local_1800 == local_17fc + 2) {
                        local_b20 = local_450 + indexType;
                        local_b28 = uVar8 + uVar12;
                        local_b1c._0_4_ = local_444;
                        local_b24 = local_45c;
                        local_b40 = uVar8 + uVar12;
                        local_b34 = local_444;
                        local_b38 = local_450;
                        local_b3c = local_45c;
                        local_b50 = local_450 + -1;
                        local_b58 = uVar8 + uVar12;
                        local_b4c = local_444;
                        local_b54 = local_45c;
                        local_1818 = (PCData<amrex::FArrayBox> *)
                                     ((((double)*(_func_int **)
                                                 (local_1400._0_8_ +
                                                 ((long)(int)(local_444 - local_1400._32_4_) +
                                                  (long)(int)(local_b20 - local_1400._36_4_) *
                                                  local_1400._8_8_ +
                                                  (long)(int)(local_45c - local_1400._40_4_) *
                                                  local_1400._16_8_ +
                                                 (long)local_b28 * local_1400._24_8_) * 8) -
                                       ((double)*(_func_int **)
                                                 (local_1400._0_8_ +
                                                 ((long)(int)(local_444 - local_1400._32_4_) +
                                                  (long)(local_450 - local_1400._36_4_) *
                                                  local_1400._8_8_ +
                                                  (long)(int)(local_45c - local_1400._40_4_) *
                                                  local_1400._16_8_ +
                                                 (long)local_b40 * local_1400._24_8_) * 8) +
                                       (double)*(_func_int **)
                                                (local_1400._0_8_ +
                                                ((long)(int)(local_444 - local_1400._32_4_) +
                                                 (long)(local_450 - local_1400._36_4_) *
                                                 local_1400._8_8_ +
                                                 (long)(int)(local_45c - local_1400._40_4_) *
                                                 local_1400._16_8_ +
                                                (long)local_b40 * local_1400._24_8_) * 8))) +
                                      (double)*(_func_int **)
                                               (local_1400._0_8_ +
                                               ((long)(int)(local_444 - local_1400._32_4_) +
                                                (long)(local_b50 - local_1400._36_4_) *
                                                local_1400._8_8_ +
                                                (long)(int)(local_45c - local_1400._40_4_) *
                                                local_1400._16_8_ +
                                               (long)local_b58 * local_1400._24_8_) * 8)) * 0.5);
                        local_b48 = (FabArray<amrex::FArrayBox> *)local_1400;
                        local_b30._M_head_impl = (FabArray<amrex::FArrayBox> *)local_1400;
                        local_b1c._4_8_ = (FabArray<amrex::FArrayBox> *)local_1400;
                      }
                      else {
                        local_1818 = (PCData<amrex::FArrayBox> *)0x0;
                      }
                      local_cb8._M_t.
                      super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl
                           = (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                              )(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                                )local_1818;
                      local_21c = uVar5;
                      local_220 = uVar6;
                      local_224 = uVar7 - local_1284;
                      if (local_1440.p
                          [(long)(uVar5 - local_1440.begin.x) +
                           (uVar6 - local_1440.begin.y) * local_1440.jstride +
                           (local_224 - local_1440.begin.z) * local_1440.kstride] ==
                          local_1400._140_4_) {
                        local_181c = local_45c - indexType;
                      }
                      else {
                        local_181c = local_45c;
                      }
                      local_c9c._0_4_ = local_181c;
                      local_234 = uVar5;
                      local_238 = uVar6;
                      local_23c = uVar7 + local_1284;
                      if (local_1440.p
                          [(long)(uVar5 - local_1440.begin.x) +
                           (uVar6 - local_1440.begin.y) * local_1440.jstride +
                           (local_23c - local_1440.begin.z) * local_1440.kstride] ==
                          local_1400._140_4_) {
                        local_1820 = local_45c + indexType;
                      }
                      else {
                        local_1820 = local_45c;
                      }
                      local_ca0 = local_1820;
                      local_1828 = (_func_int **)&DAT_3ff0000000000000;
                      if (local_1820 != local_181c + indexType) {
                        local_1828 = (_func_int **)0x3fe0000000000000;
                      }
                      local_ca8 = local_1828;
                      local_b64 = local_444;
                      local_b68 = local_450;
                      local_b6c = local_1820;
                      local_b70 = uVar8 + uVar12;
                      local_b7c = local_444;
                      local_b80 = local_450;
                      local_b84 = local_181c;
                      local_b88 = uVar8 + uVar12;
                      local_cc0._M_t.
                      super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl
                           = (__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
                              )((double)local_1828 *
                               ((double)*(_func_int **)
                                         (local_1400._0_8_ +
                                         ((long)(int)(local_444 - local_1400._32_4_) +
                                          (long)(local_450 - local_1400._36_4_) * local_1400._8_8_ +
                                          (long)(int)(local_1820 - local_1400._40_4_) *
                                          local_1400._16_8_ + (long)local_b70 * local_1400._24_8_) *
                                         8) -
                               (double)*(_func_int **)
                                        (local_1400._0_8_ +
                                        ((long)(int)(local_444 - local_1400._32_4_) +
                                         (long)(local_450 - local_1400._36_4_) * local_1400._8_8_ +
                                         (long)(int)(local_181c - local_1400._40_4_) *
                                         local_1400._16_8_ + (long)local_b88 * local_1400._24_8_) *
                                        8)));
                      if (local_1820 == local_181c + coarsenRatio) {
                        local_b9c = local_45c + indexType;
                        local_ba0 = uVar8 + uVar12;
                        local_b94 = local_444;
                        local_b98 = local_450;
                        local_bb8 = uVar8 + uVar12;
                        local_bac = local_444;
                        local_bb0 = local_450;
                        local_bb4 = local_45c;
                        local_bcc = local_45c - indexType;
                        local_bd0 = uVar8 + uVar12;
                        local_bc4 = local_444;
                        local_bc8 = local_450;
                        local_1838 = (((double)*(_func_int **)
                                                (local_1400._0_8_ +
                                                ((long)(int)(local_444 - local_1400._32_4_) +
                                                 (long)(local_450 - local_1400._36_4_) *
                                                 local_1400._8_8_ +
                                                 (long)(local_b9c - local_1400._40_4_) *
                                                 local_1400._16_8_ +
                                                (long)local_ba0 * local_1400._24_8_) * 8) -
                                      ((double)*(_func_int **)
                                                (local_1400._0_8_ +
                                                ((long)(int)(local_444 - local_1400._32_4_) +
                                                 (long)(local_450 - local_1400._36_4_) *
                                                 local_1400._8_8_ +
                                                 (long)(int)(local_45c - local_1400._40_4_) *
                                                 local_1400._16_8_ +
                                                (long)local_bb8 * local_1400._24_8_) * 8) +
                                      (double)*(_func_int **)
                                               (local_1400._0_8_ +
                                               ((long)(int)(local_444 - local_1400._32_4_) +
                                                (long)(local_450 - local_1400._36_4_) *
                                                local_1400._8_8_ +
                                                (long)(int)(local_45c - local_1400._40_4_) *
                                                local_1400._16_8_ +
                                               (long)local_bb8 * local_1400._24_8_) * 8))) +
                                     (double)*(_func_int **)
                                              (local_1400._0_8_ +
                                              ((long)(int)(local_444 - local_1400._32_4_) +
                                               (long)(local_450 - local_1400._36_4_) *
                                               local_1400._8_8_ +
                                               (long)(local_bcc - local_1400._40_4_) *
                                               local_1400._16_8_ +
                                              (long)local_bd0 * local_1400._24_8_) * 8)) * 0.5;
                        local_bc0 = (FabArray<amrex::FArrayBox> *)local_1400;
                        local_ba8 = (FabArray<amrex::FArrayBox> *)local_1400;
                        local_b90 = (FabArray<amrex::FArrayBox> *)local_1400;
                      }
                      else {
                        local_1838 = 0.0;
                      }
                      local_cc8 = local_1838;
                      local_24c = uVar5;
                      local_250 = uVar6 - local_128c._4_4_;
                      local_254 = uVar7 - local_1284;
                      if (local_1440.p
                          [(long)(uVar5 - local_1440.begin.x) +
                           (local_250 - local_1440.begin.y) * local_1440.jstride +
                           (local_254 - local_1440.begin.z) * local_1440.kstride] ==
                          local_1400._140_4_) {
                        local_268 = uVar6 + local_128c._4_4_;
                        local_26c = uVar7 - local_1284;
                        local_264 = uVar5;
                        local_260 = &local_1440;
                        if (local_1440.p
                            [(long)(uVar5 - local_1440.begin.x) +
                             (local_268 - local_1440.begin.y) * local_1440.jstride +
                             (local_26c - local_1440.begin.z) * local_1440.kstride] !=
                            local_1400._140_4_) goto LAB_018cfaaf;
                        local_280 = uVar6 - local_128c._4_4_;
                        local_284 = uVar7 + local_1284;
                        local_27c = uVar5;
                        local_278 = &local_1440;
                        if (local_1440.p
                            [(long)(uVar5 - local_1440.begin.x) +
                             (local_280 - local_1440.begin.y) * local_1440.jstride +
                             (local_284 - local_1440.begin.z) * local_1440.kstride] !=
                            local_1400._140_4_) goto LAB_018cfaaf;
                        local_298 = uVar6 + local_128c._4_4_;
                        local_29c = uVar7 + local_1284;
                        local_294 = uVar5;
                        local_290 = &local_1440;
                        if (local_1440.p
                            [(long)(uVar5 - local_1440.begin.x) +
                             (local_298 - local_1440.begin.y) * local_1440.jstride +
                             (local_29c - local_1440.begin.z) * local_1440.kstride] !=
                            local_1400._140_4_) goto LAB_018cfaaf;
                        local_be0 = local_450 + 1;
                        local_be4 = local_45c + indexType;
                        local_be8 = uVar8 + uVar12;
                        local_bdc = local_444;
                        local_bf8 = local_450 - 1;
                        local_bfc = local_45c + indexType;
                        local_c00 = uVar8 + uVar12;
                        local_bf4 = local_444;
                        local_c10 = local_450 + -1;
                        local_c14 = local_45c - indexType;
                        local_c18 = uVar8 + uVar12;
                        local_c0c = local_444;
                        local_c28 = local_450 + 1;
                        local_c2c = local_45c - indexType;
                        local_c30 = uVar8 + uVar12;
                        local_c24 = local_444;
                        local_1840 = ((((double)*(_func_int **)
                                                 (local_1400._0_8_ +
                                                 ((long)(int)(local_444 - local_1400._32_4_) +
                                                  (long)(local_be0 - local_1400._36_4_) *
                                                  local_1400._8_8_ +
                                                  (long)(local_be4 - local_1400._40_4_) *
                                                  local_1400._16_8_ +
                                                 (long)local_be8 * local_1400._24_8_) * 8) -
                                       (double)*(_func_int **)
                                                (local_1400._0_8_ +
                                                ((long)(int)(local_444 - local_1400._32_4_) +
                                                 (long)(int)(local_bf8 - local_1400._36_4_) *
                                                 local_1400._8_8_ +
                                                 (long)(local_bfc - local_1400._40_4_) *
                                                 local_1400._16_8_ +
                                                (long)local_c00 * local_1400._24_8_) * 8)) +
                                      (double)*(_func_int **)
                                               (local_1400._0_8_ +
                                               ((long)(int)(local_444 - local_1400._32_4_) +
                                                (long)(local_c10 - local_1400._36_4_) *
                                                local_1400._8_8_ +
                                                (long)(local_c14 - local_1400._40_4_) *
                                                local_1400._16_8_ +
                                               (long)local_c18 * local_1400._24_8_) * 8)) -
                                     (double)*(_func_int **)
                                              (local_1400._0_8_ +
                                              ((long)(int)(local_444 - local_1400._32_4_) +
                                               (long)(local_c28 - local_1400._36_4_) *
                                               local_1400._8_8_ +
                                               (long)(local_c2c - local_1400._40_4_) *
                                               local_1400._16_8_ +
                                              (long)local_c30 * local_1400._24_8_) * 8)) * 0.25;
                        local_c20 = (FabArray<amrex::FArrayBox> *)local_1400;
                        local_c08 = (FabArray<amrex::FArrayBox> *)local_1400;
                        local_bf0 = (FabArray<amrex::FArrayBox> *)local_1400;
                        local_bd8.data = (BARef *)local_1400;
                      }
                      else {
LAB_018cfaaf:
                        local_1840 = 0.0;
                      }
                      local_cd0 = local_1840;
                      local_cd8 = ((double)(uVar6 - local_450 * local_128c._4_4_) + 0.5) /
                                  (double)local_128c._4_4_ + -0.5;
                      local_ce0 = (pointer)(((double)(int)(uVar7 - local_45c * local_1284) + 0.5) /
                                            (double)local_1284 + -0.5);
                      local_c3c = local_444;
                      local_c40 = local_450;
                      local_c44 = local_45c;
                      local_c48 = uVar8 + uVar12;
                      local_ad4 = uVar5;
                      local_ad8 = uVar6;
                      local_b1c.m_bndryReg.m_doihi.vect[2] = uVar7;
                      local_b1c.m_bndryReg.m_doihi.vect[1] = uVar8 + uVar11;
                      *(double *)
                       (local_1278._0_8_ +
                       ((long)(uVar5 - local_1258) +
                        (long)(uVar6 - local_1254) * local_1278._M_string_length +
                        (long)(uVar7 - local_1250) * local_1278.field_2._M_allocated_capacity +
                       (long)local_b1c.m_bndryReg.m_doihi.vect[1] * local_1278.field_2._8_8_) * 8) =
                           local_cd8 * (double)local_ce0 * local_1840 +
                           (double)local_ce0 * (double)local_ce0 * local_1838 +
                           (double)local_ce0 *
                           (double)local_cc0._M_t.
                                   super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                                   .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>.
                                   _M_head_impl +
                           local_cd8 * local_cd8 * (double)local_1818 +
                           local_cd8 *
                           (double)local_cb0._M_t.
                                   super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                                   .
                                   super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>
                                   ._M_head_impl +
                           (double)*(_func_int **)
                                    (local_1400._0_8_ +
                                    ((long)(int)(local_444 - local_1400._32_4_) +
                                     (long)(local_450 - local_1400._36_4_) * local_1400._8_8_ +
                                     (long)(int)(local_45c - local_1400._40_4_) * local_1400._16_8_
                                    + (long)local_c48 * local_1400._24_8_) * 8);
                      local_c9c._20_8_ = &local_1440;
                      local_c9c._44_8_ = (FabArray<amrex::FArrayBox> *)local_1400;
                      local_c38 = (FabArray<amrex::FArrayBox> *)local_1400;
                      local_b78.hp = (Array4<const_double> *)local_1400;
                      local_b60 = (FabArray<amrex::FArrayBox> *)local_1400;
                      local_b1c._28_8_ = (FabArray<amrex::FArrayBox> *)local_1400;
                      local_b1c._52_8_ = (FabArray<amrex::FArrayBox> *)local_1400;
                      local_ad0._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c9c._60_8_;
                      local_248 = &local_1440;
                      local_230 = &local_1440;
                      local_218 = &local_1440;
                      local_200 = &local_1440;
                      local_1e8 = &local_1440;
                    }
                  }
                }
              }
            }
            else if (local_11dc == 1) {
              local_ed8.data = (BARef *)local_1280._M_head_impl;
              local_518 = local_1280._M_head_impl;
              local_51c = 0;
              local_ecc = *(int *)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                    &(local_1280._M_head_impl)->cpc)->
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
              local_528 = local_1280._M_head_impl;
              local_52c = 1;
              iStack_ec8 = *(int *)((long)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                            &(local_1280._M_head_impl)->cpc)->
                                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4);
              local_146c._12_8_ =
                   (((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                    &(local_1280._M_head_impl)->cpc)->
                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_538 = local_1280._M_head_impl;
              local_53c = 2;
              local_1458 = *(uint *)&(local_1280._M_head_impl)->src;
              local_e20.m_op._12_8_ = local_1280._M_head_impl;
              local_608 = (int *)((long)&(local_1280._M_head_impl)->src + 4);
              local_60c = 0;
              local_e20.m_op.m_bndryReg.m_loshft.vect[1] = *local_608;
              local_618 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
              local_61c = 1;
              local_e20.m_op.m_bndryReg.m_loshft.vect[2] = (local_1280._M_head_impl)->op;
              local_14d0._80_8_ = *(undefined8 *)local_608;
              local_628 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
              local_62c = 2;
              local_1478 = (local_1280._M_head_impl)->tag;
              local_146c._0_8_ = local_14d0._80_8_;
              local_146c._8_4_ = local_1478;
              local_1450 = (pointer)local_146c._12_8_;
              local_1448 = local_1458;
              local_ee8 = (pointer)local_146c._12_8_;
              local_ee0 = local_1458;
              local_ec4 = local_1458;
              local_e20._0_8_ = local_14d0._80_8_;
              local_e20.m_op.m_bndryReg.m_typ.itype = (IndexType)local_1478;
              local_e20.m_op.m_bndryReg.m_hishft.vect[0] = local_1478;
              for (local_14d0._76_4_ = 0; (int)local_14d0._76_4_ < in_stack_00000008;
                  local_14d0._76_4_ = local_14d0._76_4_ + 1) {
                for (local_14d0._72_4_ = local_1448; (int)local_14d0._72_4_ <= (int)local_146c._8_4_
                    ; local_14d0._72_4_ = local_14d0._72_4_ + 1) {
                  for (local_14d0._68_4_ = local_1450._4_4_;
                      (int)local_14d0._68_4_ <= (int)local_146c._4_4_;
                      local_14d0._68_4_ = local_14d0._68_4_ + 1) {
                    for (local_14d0._64_4_ = (uint)local_1450; uVar11 = local_f70,
                        uVar8 = local_14d0._76_4_, uVar7 = local_14d0._72_4_,
                        uVar6 = local_14d0._68_4_, uVar5 = local_14d0._64_4_,
                        (int)local_14d0._64_4_ <= (int)local_146c._0_4_;
                        local_14d0._64_4_ = local_14d0._64_4_ + 1) {
                      Array4<const_double>::Array4<const_double,_0>
                                ((Array4<const_double> *)local_14d0,&local_1230);
                      uVar12 = local_f5c;
                      Array4<const_int>::Array4<const_int,_0>
                                (&local_1510,(Array4<int> *)(local_1400 + 0x90));
                      local_a34 = uVar5;
                      local_a38 = uVar6;
                      local_a3c = uVar7;
                      local_a40 = uVar8;
                      local_a74 = local_1400._140_4_;
                      local_a48 = &local_1278;
                      local_a68 = &local_128c;
                      local_46c = uVar5;
                      local_470 = (uint)local_128c;
                      if ((uint)local_128c == 1) {
                        local_468 = uVar5;
                      }
                      else if ((uint)local_128c == 2) {
                        if ((int)uVar5 < 0) {
                          iVar14 = uVar5 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_1878 = -iVar14 / 2 - 1;
                        }
                        else {
                          local_1878 = (int)uVar5 / 2;
                        }
                        local_468 = local_1878;
                      }
                      else if ((uint)local_128c == 4) {
                        if ((int)uVar5 < 0) {
                          iVar14 = uVar5 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_187c = -iVar14 / 4 - 1;
                        }
                        else {
                          local_187c = (int)uVar5 / 4;
                        }
                        local_468 = local_187c;
                      }
                      else {
                        if ((int)uVar5 < 0) {
                          iVar14 = uVar5 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_1880 = -iVar14 / (int)(uint)local_128c - 1;
                        }
                        else {
                          local_1880 = (int)uVar5 / (int)(uint)local_128c;
                        }
                        local_468 = local_1880;
                      }
                      local_a78 = local_468;
                      local_478 = uVar6;
                      local_47c = local_128c._4_4_;
                      if (local_128c._4_4_ == 1) {
                        local_474.itype = uVar6;
                      }
                      else if (local_128c._4_4_ == 2) {
                        if ((int)uVar6 < 0) {
                          iVar14 = uVar6 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_1888 = -iVar14 / 2 - 1;
                        }
                        else {
                          local_1888 = (int)uVar6 / 2;
                        }
                        local_474.itype = local_1888;
                      }
                      else if (local_128c._4_4_ == 4) {
                        if ((int)uVar6 < 0) {
                          iVar14 = uVar6 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_188c = -iVar14 / 4 - 1;
                        }
                        else {
                          local_188c = (int)uVar6 / 4;
                        }
                        local_474.itype = local_188c;
                      }
                      else {
                        if ((int)uVar6 < 0) {
                          iVar14 = uVar6 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_1890 = -iVar14 / local_128c._4_4_ - 1;
                        }
                        else {
                          local_1890 = (int)uVar6 / local_128c._4_4_;
                        }
                        local_474.itype = local_1890;
                      }
                      local_a7c = local_474.itype;
                      local_484 = uVar7;
                      local_488 = local_1284;
                      if (local_1284 == 1) {
                        local_480 = uVar7;
                      }
                      else if (local_1284 == 2) {
                        if ((int)uVar7 < 0) {
                          iVar14 = uVar7 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_1898 = -iVar14 / 2 - 1;
                        }
                        else {
                          local_1898 = (int)uVar7 / 2;
                        }
                        local_480 = local_1898;
                      }
                      else if (local_1284 == 4) {
                        if ((int)uVar7 < 0) {
                          iVar14 = uVar7 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_189c = -iVar14 / 4 - 1;
                        }
                        else {
                          local_189c = (int)uVar7 / 4;
                        }
                        local_480 = local_189c;
                      }
                      else {
                        if ((int)uVar7 < 0) {
                          iVar14 = uVar7 + 1;
                          if (iVar14 < 1) {
                            iVar14 = -iVar14;
                          }
                          local_18a0 = -iVar14 / local_1284 - 1;
                        }
                        else {
                          local_18a0 = (int)uVar7 / local_1284;
                        }
                        local_480 = local_18a0;
                      }
                      local_a80 = local_480;
                      local_2ac = uVar5 - (uint)local_128c;
                      local_2b0 = uVar6;
                      local_2b4 = uVar7;
                      if (local_1510.p
                          [(long)(local_2ac - local_1510.begin.x) +
                           (uVar6 - local_1510.begin.y) * local_1510.jstride +
                           (uVar7 - local_1510.begin.z) * local_1510.kstride] == local_1400._140_4_)
                      {
                        local_18a4 = local_468 - 1;
                      }
                      else {
                        local_18a4 = local_468;
                      }
                      local_2c4 = uVar5 + (uint)local_128c;
                      local_2c8 = uVar6;
                      local_2cc = uVar7;
                      if (local_1510.p
                          [(long)(local_2c4 - local_1510.begin.x) +
                           (uVar6 - local_1510.begin.y) * local_1510.jstride +
                           (uVar7 - local_1510.begin.z) * local_1510.kstride] == local_1400._140_4_)
                      {
                        local_18a8 = local_468 + 1;
                      }
                      else {
                        local_18a8 = local_468;
                      }
                      local_18b0 = 1.0;
                      if (local_18a8 != local_18a4 + 1) {
                        local_18b0 = 0.5;
                      }
                      local_8d4 = local_18a8;
                      local_8d8 = local_474.itype;
                      local_8dc = local_480;
                      local_8e0 = uVar8 + uVar12;
                      local_8ec = local_18a4;
                      local_8f0 = local_474.itype;
                      local_8f4 = local_480;
                      local_8f8 = uVar8 + uVar12;
                      local_a98 = (pointer)(local_18b0 *
                                           (*(double *)
                                             (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))
                                               ->super_CommMetaData).m_threadsafe_loc +
                                             ((long)(int)(local_18a8 - local_14d0._32_4_) +
                                              (long)(int)(local_474.itype - local_14d0._36_4_) *
                                              local_14d0._8_8_ +
                                              (long)(int)(local_480 - local_14d0._40_4_) *
                                              local_14d0._16_8_ +
                                             (long)local_8e0 * local_14d0._24_8_) * 8) -
                                           *(double *)
                                            (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                              super_CommMetaData).m_threadsafe_loc +
                                            ((long)(int)(local_18a4 - local_14d0._32_4_) +
                                             (long)(int)(local_474.itype - local_14d0._36_4_) *
                                             local_14d0._8_8_ +
                                             (long)(int)(local_480 - local_14d0._40_4_) *
                                             local_14d0._16_8_ +
                                            (long)(int)local_8f8 * local_14d0._24_8_) * 8)));
                      if (local_18a8 == local_18a4 + 2) {
                        local_904 = local_468 + 1;
                        local_910 = uVar8 + uVar12;
                        local_908 = local_474.itype;
                        local_90c = local_480;
                        local_928 = uVar8 + uVar12;
                        local_91c = local_468;
                        local_920 = local_474.itype;
                        local_924 = local_480;
                        dVar1 = *(double *)
                                 (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                   super_CommMetaData).m_threadsafe_loc +
                                 ((long)(int)(local_468 - local_14d0._32_4_) +
                                  (long)(int)(local_474.itype - local_14d0._36_4_) *
                                  local_14d0._8_8_ +
                                  (long)(int)(local_480 - local_14d0._40_4_) * local_14d0._16_8_ +
                                 (long)local_928 * local_14d0._24_8_) * 8);
                        local_934 = local_468 - 1;
                        local_940 = uVar8 + uVar12;
                        local_938 = local_474.itype;
                        local_93c = local_480;
                        local_18c0 = (pointer)(((*(double *)
                                                  (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) +
                                                            -3))->super_CommMetaData).
                                                    m_threadsafe_loc +
                                                  ((long)(local_904 - local_14d0._32_4_) +
                                                   (long)(int)(local_474.itype - local_14d0._36_4_)
                                                   * local_14d0._8_8_ +
                                                   (long)(int)(local_480 - local_14d0._40_4_) *
                                                   local_14d0._16_8_ +
                                                  (long)local_910 * local_14d0._24_8_) * 8) -
                                                (dVar1 + dVar1)) +
                                               *(double *)
                                                (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3
                                                          ))->super_CommMetaData).m_threadsafe_loc +
                                                ((long)(local_934 - local_14d0._32_4_) +
                                                 (long)(int)(local_474.itype - local_14d0._36_4_) *
                                                 local_14d0._8_8_ +
                                                 (long)(int)(local_480 - local_14d0._40_4_) *
                                                 local_14d0._16_8_ +
                                                (long)local_940 * local_14d0._24_8_) * 8)) * 0.5);
                        local_930._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_14d0
                        ;
                        local_918 = (FBData<amrex::FArrayBox> *)local_14d0;
                        local_900 = (FBData<amrex::FArrayBox> *)local_14d0;
                      }
                      else {
                        local_18c0 = (pointer)0x0;
                      }
                      local_aa0 = local_18c0;
                      local_2dc = uVar5;
                      local_2e0 = uVar6;
                      local_2e4 = uVar7 - local_1284;
                      if (local_1510.p
                          [(long)(uVar5 - local_1510.begin.x) +
                           (uVar6 - local_1510.begin.y) * local_1510.jstride +
                           (local_2e4 - local_1510.begin.z) * local_1510.kstride] ==
                          local_1400._140_4_) {
                        local_18c4 = local_480 - 1;
                      }
                      else {
                        local_18c4 = local_480;
                      }
                      local_a84 = local_18c4;
                      local_2f4 = uVar5;
                      local_2f8 = uVar6;
                      local_2fc = uVar7 + local_1284;
                      if (local_1510.p
                          [(long)(uVar5 - local_1510.begin.x) +
                           (uVar6 - local_1510.begin.y) * local_1510.jstride +
                           (local_2fc - local_1510.begin.z) * local_1510.kstride] ==
                          local_1400._140_4_) {
                        local_18c8 = local_480 + 1;
                      }
                      else {
                        local_18c8 = local_480;
                      }
                      local_a88 = local_18c8;
                      local_18d0 = (_Bit_type *)&DAT_3ff0000000000000;
                      if (local_18c8 != local_18c4 + 1) {
                        local_18d0 = (_Bit_type *)0x3fe0000000000000;
                      }
                      local_a90 = local_18d0;
                      local_94c = local_468;
                      local_950 = local_474.itype;
                      local_954 = local_18c8;
                      local_958 = uVar8 + uVar12;
                      local_99c.m_bndryReg.m_doihi.vect[0] = local_468;
                      local_99c.m_bndryReg.m_doilo.vect[2] = local_474.itype;
                      local_99c.m_bndryReg.m_doilo.vect[1] = local_18c4;
                      local_99c.m_bndryReg.m_doilo.vect[0] = uVar8 + uVar12;
                      local_aa8 = (pointer)((double)local_18d0 *
                                           (*(double *)
                                             (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))
                                               ->super_CommMetaData).m_threadsafe_loc +
                                             ((long)(int)(local_468 - local_14d0._32_4_) +
                                              (long)(int)(local_474.itype - local_14d0._36_4_) *
                                              local_14d0._8_8_ +
                                              (long)(int)(local_18c8 - local_14d0._40_4_) *
                                              local_14d0._16_8_ +
                                             (long)local_958 * local_14d0._24_8_) * 8) -
                                           *(double *)
                                            (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                              super_CommMetaData).m_threadsafe_loc +
                                            ((long)(int)(local_468 - local_14d0._32_4_) +
                                             (long)(int)(local_474.itype - local_14d0._36_4_) *
                                             local_14d0._8_8_ +
                                             (long)(int)(local_18c4 - local_14d0._40_4_) *
                                             local_14d0._16_8_ +
                                            (long)local_99c.m_bndryReg.m_doilo.vect[0] *
                                            local_14d0._24_8_) * 8)));
                      if (local_18c8 == local_18c4 + 2) {
                        local_99c.m_bndryReg.m_loshft.vect[1] = local_480 + 1;
                        local_99c.m_bndryReg.m_loshft.vect[0] = uVar8 + uVar12;
                        local_99c.m_bndryReg.m_hishft.vect[0] = local_468;
                        local_99c.m_bndryReg.m_loshft.vect[2] = local_474.itype;
                        local_9a0 = uVar8 + uVar12;
                        local_99c.m_bndryReg.m_crse_ratio.vect[0] = local_468;
                        local_99c.m_bndryReg.m_typ.itype = (IndexType)(IndexType)local_474.itype;
                        local_99c._0_4_ = local_480;
                        dVar1 = *(double *)
                                 (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                   super_CommMetaData).m_threadsafe_loc +
                                 ((long)(int)(local_468 - local_14d0._32_4_) +
                                  (long)(int)(local_474.itype - local_14d0._36_4_) *
                                  local_14d0._8_8_ +
                                  (long)(int)(local_480 - local_14d0._40_4_) * local_14d0._16_8_ +
                                 (long)(int)local_9a0 * local_14d0._24_8_) * 8);
                        local_9b4 = local_480 - 1;
                        local_9b8 = uVar8 + uVar12;
                        local_9ac = local_468;
                        local_9b0 = local_474.itype;
                        local_18e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     (((*(double *)
                                         (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                           super_CommMetaData).m_threadsafe_loc +
                                         ((long)(int)(local_468 - local_14d0._32_4_) +
                                          (long)(int)(local_474.itype - local_14d0._36_4_) *
                                          local_14d0._8_8_ +
                                          (long)(local_99c.m_bndryReg.m_loshft.vect[1] -
                                                local_14d0._40_4_) * local_14d0._16_8_ +
                                         (long)local_99c.m_bndryReg.m_loshft.vect[0] *
                                         local_14d0._24_8_) * 8) - (dVar1 + dVar1)) +
                                      *(double *)
                                       (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                         super_CommMetaData).m_threadsafe_loc +
                                       ((long)(int)(local_468 - local_14d0._32_4_) +
                                        (long)(int)(local_474.itype - local_14d0._36_4_) *
                                        local_14d0._8_8_ +
                                        (long)(local_9b4 - local_14d0._40_4_) * local_14d0._16_8_ +
                                       (long)local_9b8 * local_14d0._24_8_) * 8)) * 0.5);
                        local_9a8 = (FBData<amrex::FArrayBox> *)local_14d0;
                        local_99c._12_8_ = (FBData<amrex::FArrayBox> *)local_14d0;
                        local_99c._36_8_ = (FBData<amrex::FArrayBox> *)local_14d0;
                      }
                      else {
                        local_18e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      }
                      local_ab0._M_pi = local_18e0;
                      local_30c = uVar5 - (uint)local_128c;
                      local_310 = uVar6;
                      local_314 = uVar7 - local_1284;
                      if (local_1510.p
                          [(long)(local_30c - local_1510.begin.x) +
                           (uVar6 - local_1510.begin.y) * local_1510.jstride +
                           (local_314 - local_1510.begin.z) * local_1510.kstride] ==
                          local_1400._140_4_) {
                        local_324 = uVar5 + (uint)local_128c;
                        local_32c = uVar7 - local_1284;
                        local_328 = uVar6;
                        local_320 = &local_1510;
                        if (local_1510.p
                            [(long)(local_324 - local_1510.begin.x) +
                             (uVar6 - local_1510.begin.y) * local_1510.jstride +
                             (local_32c - local_1510.begin.z) * local_1510.kstride] !=
                            local_1400._140_4_) goto LAB_018d1687;
                        local_33c = uVar5 - (uint)local_128c;
                        local_344 = uVar7 + local_1284;
                        local_340 = uVar6;
                        local_338 = &local_1510;
                        if (local_1510.p
                            [(long)(local_33c - local_1510.begin.x) +
                             (uVar6 - local_1510.begin.y) * local_1510.jstride +
                             (local_344 - local_1510.begin.z) * local_1510.kstride] !=
                            local_1400._140_4_) goto LAB_018d1687;
                        local_354 = uVar5 + (uint)local_128c;
                        local_35c = uVar7 + local_1284;
                        local_358 = uVar6;
                        local_350 = &local_1510;
                        if (local_1510.p
                            [(long)(local_354 - local_1510.begin.x) +
                             (uVar6 - local_1510.begin.y) * local_1510.jstride +
                             (local_35c - local_1510.begin.z) * local_1510.kstride] !=
                            local_1400._140_4_) goto LAB_018d1687;
                        local_9c4 = local_468 + 1;
                        local_9cc = local_480 + 1;
                        local_9d0 = uVar8 + uVar12;
                        local_9c8 = local_474.itype;
                        local_9dc = local_468 - 1;
                        local_9e4 = local_480 + 1;
                        local_9e8 = uVar8 + uVar12;
                        local_9e0 = local_474.itype;
                        local_9f4 = local_468 - 1;
                        local_9fc = local_480 - 1;
                        local_a00 = uVar8 + uVar12;
                        local_9f8 = local_474.itype;
                        local_a0c = local_468 + 1;
                        local_a14 = local_480 - 1;
                        local_a18 = uVar8 + uVar12;
                        local_a10 = local_474.itype;
                        local_18e8 = (element_type *)
                                     ((((*(double *)
                                          (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                            super_CommMetaData).m_threadsafe_loc +
                                          ((long)(local_9c4 - local_14d0._32_4_) +
                                           (long)(int)(local_474.itype - local_14d0._36_4_) *
                                           local_14d0._8_8_ +
                                           (long)(local_9cc - local_14d0._40_4_) * local_14d0._16_8_
                                          + (long)local_9d0 * local_14d0._24_8_) * 8) -
                                        *(double *)
                                         (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                           super_CommMetaData).m_threadsafe_loc +
                                         ((long)(local_9dc - local_14d0._32_4_) +
                                          (long)(int)(local_474.itype - local_14d0._36_4_) *
                                          local_14d0._8_8_ +
                                          (long)(local_9e4 - local_14d0._40_4_) * local_14d0._16_8_
                                         + (long)local_9e8 * local_14d0._24_8_) * 8)) +
                                       *(double *)
                                        (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                          super_CommMetaData).m_threadsafe_loc +
                                        ((long)(local_9f4 - local_14d0._32_4_) +
                                         (long)(int)(local_474.itype - local_14d0._36_4_) *
                                         local_14d0._8_8_ +
                                         (long)(local_9fc - local_14d0._40_4_) * local_14d0._16_8_ +
                                        (long)local_a00 * local_14d0._24_8_) * 8)) -
                                      *(double *)
                                       (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                                         super_CommMetaData).m_threadsafe_loc +
                                       ((long)(local_a0c - local_14d0._32_4_) +
                                        (long)(int)(local_474.itype - local_14d0._36_4_) *
                                        local_14d0._8_8_ +
                                        (long)(local_a14 - local_14d0._40_4_) * local_14d0._16_8_ +
                                       (long)local_a18 * local_14d0._24_8_) * 8)) * 0.25);
                        local_a08 = (FBData<amrex::FArrayBox> *)local_14d0;
                        local_9f0 = (FBData<amrex::FArrayBox> *)local_14d0;
                        local_9d8 = (FBData<amrex::FArrayBox> *)local_14d0;
                        local_9c0._M_head_impl = (FBData<amrex::FArrayBox> *)local_14d0;
                      }
                      else {
LAB_018d1687:
                        local_18e8 = (element_type *)0x0;
                      }
                      local_ab8 = local_18e8;
                      local_ac0._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           (((double)(int)(uVar5 - local_468 * (uint)local_128c) + 0.5) /
                            (double)(int)(uint)local_128c + -0.5);
                      local_ac8 = (element_type *)
                                  (((double)(int)(uVar7 - local_480 * local_1284) + 0.5) /
                                   (double)local_1284 + -0.5);
                      local_a24 = local_468;
                      local_a28 = local_474.itype;
                      local_a2c = local_480;
                      local_a30 = uVar8 + uVar12;
                      local_8bc = uVar5;
                      local_8c0 = uVar6;
                      local_8c4 = uVar7;
                      local_8c8 = uVar8 + uVar11;
                      *(double *)
                       (local_1278._0_8_ +
                       ((long)(uVar5 - local_1258) +
                        (long)(uVar6 - local_1254) * local_1278._M_string_length +
                        (long)(uVar7 - local_1250) * local_1278.field_2._M_allocated_capacity +
                       (long)local_8c8 * local_1278.field_2._8_8_) * 8) =
                           (double)local_ac0._M_pi * (double)local_ac8 * (double)local_18e8 +
                           (double)local_ac8 * (double)local_ac8 * (double)local_18e0 +
                           (double)local_ac8 * (double)local_aa8 +
                           (double)local_ac0._M_pi * (double)local_ac0._M_pi * (double)local_18c0 +
                           (double)local_ac0._M_pi * (double)local_a98 +
                           *(double *)
                            (&(((FB *)((IntVect *)(local_14d0._0_8_ + 0x24) + -3))->
                              super_CommMetaData).m_threadsafe_loc +
                            ((long)(int)(local_468 - local_14d0._32_4_) +
                             (long)(int)(local_474.itype - local_14d0._36_4_) * local_14d0._8_8_ +
                             (long)(int)(local_480 - local_14d0._40_4_) * local_14d0._16_8_ +
                            (long)local_a30 * local_14d0._24_8_) * 8);
                      local_a70 = &local_1510;
                      local_a58.data = (BARef *)local_14d0;
                      local_a20 = (FBData<amrex::FArrayBox> *)local_14d0;
                      local_99c._60_8_ = (FBData<amrex::FArrayBox> *)local_14d0;
                      local_948 = (FBData<amrex::FArrayBox> *)local_14d0;
                      local_8e8 = (FBData<amrex::FArrayBox> *)local_14d0;
                      local_8d0.data = (Ref *)local_14d0;
                      local_8b8._M_t.
                      super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                      _M_head_impl = (__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                                      )(__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                                        )local_a48;
                      local_308 = &local_1510;
                      local_2f0 = &local_1510;
                      local_2d8 = &local_1510;
                      local_2c0 = &local_1510;
                      local_2a8 = &local_1510;
                    }
                  }
                }
              }
            }
            else if (local_11dc == 2) {
              local_f00 = local_1280._M_head_impl;
              local_4e8 = local_1280._M_head_impl;
              local_4ec = 0;
              local_ef4 = *(int *)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                    &(local_1280._M_head_impl)->cpc)->
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
              local_4f8 = local_1280._M_head_impl;
              local_4fc = 1;
              iStack_ef0 = *(int *)((long)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                            &(local_1280._M_head_impl)->cpc)->
                                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4);
              local_1530 = (((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                            &(local_1280._M_head_impl)->cpc)->
                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start;
              local_508 = local_1280._M_head_impl;
              local_50c = 2;
              local_1528 = *(uint *)&(local_1280._M_head_impl)->src;
              local_e38._M_t.
              super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
                   (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                    )(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                      )local_1280._M_head_impl;
              local_5d8 = (Long *)((long)&(local_1280._M_head_impl)->src + 4);
              local_5dc = 0;
              local_e2c = *(undefined4 *)local_5d8;
              local_5e8 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
              local_5ec = 1;
              uStack_e28 = (local_1280._M_head_impl)->op;
              local_1550 = *local_5d8;
              local_5f8 = (undefined1 *)((long)&(local_1280._M_head_impl)->src + 4);
              local_5fc = 2;
              local_1548 = (local_1280._M_head_impl)->tag;
              local_153c = local_1550;
              local_1534 = local_1548;
              local_1520 = local_1530;
              local_1518 = local_1528;
              local_f10 = local_1530;
              local_f08 = local_1528;
              local_eec = local_1528;
              local_e48 = local_1550;
              local_e40 = local_1548;
              local_e24 = local_1548;
              for (local_1554 = null; (int)local_1554 < in_stack_00000008;
                  local_1554 = local_1554 + indexType) {
                for (local_1558 = local_1518; (int)local_1558 <= local_1534;
                    local_1558 = local_1558 + 1) {
                  for (local_155c = local_1520._4_4_; (int)local_155c <= local_153c._4_4_;
                      local_155c = local_155c + 1) {
                    for (local_1560 = (int)local_1520; uVar5 = local_f70, BVar4 = local_1554,
                        uVar3 = local_1558, uVar2 = local_155c, iVar14 = local_1560,
                        local_1560 <= (int)local_153c; local_1560 = local_1560 + 1) {
                      Array4<const_double>::Array4<const_double,_0>
                                ((Array4<const_double> *)&local_15a0,&local_1230);
                      uVar6 = local_f5c;
                      Array4<const_int>::Array4<const_int,_0>
                                (&local_15e0,(Array4<int> *)(local_1400 + 0x90));
                      local_824.m_bndryReg.m_crse_ratio.vect[0] = iVar14;
                      local_824.m_bndryReg.m_typ.itype = (IndexType)uVar2;
                      local_824._0_4_ = uVar3;
                      local_828 = BVar4;
                      local_85c = local_1400._140_4_;
                      local_830._M_t.
                      super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>.
                      _M_head_impl = (__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
                                      )&local_1278;
                      local_850 = &local_128c;
                      local_490 = iVar14;
                      local_494 = (uint)local_128c;
                      if ((uint)local_128c == 1) {
                        local_48c = iVar14;
                      }
                      else if ((uint)local_128c == 2) {
                        if (iVar14 < 0) {
                          iVar15 = iVar14 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1920 = -iVar15 / 2 + -1;
                        }
                        else {
                          local_1920 = iVar14 / 2;
                        }
                        local_48c = local_1920;
                      }
                      else if ((uint)local_128c == 4) {
                        if (iVar14 < 0) {
                          iVar15 = iVar14 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1924 = -iVar15 / 4 + -1;
                        }
                        else {
                          local_1924 = iVar14 / 4;
                        }
                        local_48c = local_1924;
                      }
                      else {
                        if (iVar14 < 0) {
                          iVar15 = iVar14 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1928 = -iVar15 / (int)(uint)local_128c + -1;
                        }
                        else {
                          local_1928 = iVar14 / (int)(uint)local_128c;
                        }
                        local_48c = local_1928;
                      }
                      local_860 = local_48c;
                      local_49c = uVar2;
                      local_4a0 = local_128c._4_4_;
                      if (local_128c._4_4_ == 1) {
                        local_498 = uVar2;
                      }
                      else if (local_128c._4_4_ == 2) {
                        if ((int)uVar2 < 0) {
                          iVar15 = uVar2 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1930 = -iVar15 / 2 - 1;
                        }
                        else {
                          local_1930 = (int)uVar2 / 2;
                        }
                        local_498 = local_1930;
                      }
                      else if (local_128c._4_4_ == 4) {
                        if ((int)uVar2 < 0) {
                          iVar15 = uVar2 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1934 = -iVar15 / 4 - 1;
                        }
                        else {
                          local_1934 = (int)uVar2 / 4;
                        }
                        local_498 = local_1934;
                      }
                      else {
                        if ((int)uVar2 < 0) {
                          iVar15 = uVar2 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1938 = -iVar15 / local_128c._4_4_ - 1;
                        }
                        else {
                          local_1938 = (int)uVar2 / local_128c._4_4_;
                        }
                        local_498 = local_1938;
                      }
                      local_864 = local_498;
                      local_4a8 = uVar3;
                      local_4ac = local_1284;
                      if (local_1284 == 1) {
                        local_4a4 = uVar3;
                      }
                      else if (local_1284 == 2) {
                        if ((int)uVar3 < 0) {
                          iVar15 = uVar3 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1940 = -iVar15 / 2 - 1;
                        }
                        else {
                          local_1940 = (int)uVar3 / 2;
                        }
                        local_4a4 = local_1940;
                      }
                      else if (local_1284 == 4) {
                        if ((int)uVar3 < 0) {
                          iVar15 = uVar3 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1944 = -iVar15 / 4 - 1;
                        }
                        else {
                          local_1944 = (int)uVar3 / 4;
                        }
                        local_4a4 = local_1944;
                      }
                      else {
                        if ((int)uVar3 < 0) {
                          iVar15 = uVar3 + 1;
                          if (iVar15 < 1) {
                            iVar15 = -iVar15;
                          }
                          local_1948 = -iVar15 / local_1284 - 1;
                        }
                        else {
                          local_1948 = (int)uVar3 / local_1284;
                        }
                        local_4a4 = local_1948;
                      }
                      local_868 = local_4a4;
                      local_36c = iVar14 - (uint)local_128c;
                      local_370 = uVar2;
                      local_374 = uVar3;
                      if (local_15e0.p
                          [(long)(local_36c - local_15e0.begin.x) +
                           (int)(uVar2 - local_15e0.begin.y) * local_15e0.jstride +
                           (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] ==
                          local_1400._140_4_) {
                        local_194c = local_48c + -1;
                      }
                      else {
                        local_194c = local_48c;
                      }
                      local_384 = iVar14 + (uint)local_128c;
                      local_388 = uVar2;
                      local_38c = uVar3;
                      if (local_15e0.p
                          [(long)(local_384 - local_15e0.begin.x) +
                           (int)(uVar2 - local_15e0.begin.y) * local_15e0.jstride +
                           (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] ==
                          local_1400._140_4_) {
                        local_1950 = local_48c + 1;
                      }
                      else {
                        local_1950 = local_48c;
                      }
                      local_1958 = 1.0;
                      if (local_1950 != local_194c + 1) {
                        local_1958 = 0.5;
                      }
                      local_6bc = local_1950;
                      local_6c0 = local_498;
                      local_6c4 = local_4a4;
                      local_6c8 = BVar4 + uVar6;
                      local_6d4 = local_194c;
                      local_6d8 = local_498;
                      local_6dc = local_4a4;
                      local_6e0 = BVar4 + uVar6;
                      local_880.hp = (Array4<double> *)
                                     (local_1958 *
                                     (*(double *)
                                       (local_15a0 +
                                       ((long)(local_1950 - local_1580) +
                                        (int)(local_498 - local_157c) * local_1598 +
                                        (int)(local_4a4 - local_1578) * local_1590 +
                                       local_6c8 * local_1588) * 8) -
                                     *(double *)
                                      (local_15a0 +
                                      ((long)(local_194c - local_1580) +
                                       (int)(local_498 - local_157c) * local_1598 +
                                       (int)(local_4a4 - local_1578) * local_1590 +
                                      local_6e0 * local_1588) * 8)));
                      if (local_1950 == local_194c + 2) {
                        local_6ec = local_48c + 1;
                        local_6f8 = BVar4 + uVar6;
                        local_6f0 = local_498;
                        local_6f4 = local_4a4;
                        local_710 = BVar4 + uVar6;
                        local_704 = local_48c;
                        local_708 = local_498;
                        local_70c = local_4a4;
                        dVar1 = *(double *)
                                 (local_15a0 +
                                 ((long)(local_48c - local_1580) +
                                  (int)(local_498 - local_157c) * local_1598 +
                                  (int)(local_4a4 - local_1578) * local_1590 +
                                 local_710 * local_1588) * 8);
                        local_71c = local_48c + -1;
                        local_728 = BVar4 + uVar6;
                        local_720 = local_498;
                        local_724 = local_4a4;
                        local_1968 = (void *)(((*(double *)
                                                 (local_15a0 +
                                                 ((long)(local_6ec - local_1580) +
                                                  (int)(local_498 - local_157c) * local_1598 +
                                                  (int)(local_4a4 - local_1578) * local_1590 +
                                                 local_6f8 * local_1588) * 8) - (dVar1 + dVar1)) +
                                              *(double *)
                                               (local_15a0 +
                                               ((long)(local_71c - local_1580) +
                                                (int)(local_498 - local_157c) * local_1598 +
                                                (int)(local_4a4 - local_1578) * local_1590 +
                                               local_728 * local_1588) * 8)) * 0.5);
                        local_718 = (FBData<amrex::FArrayBox> *)&local_15a0;
                        local_700 = (FBData<amrex::FArrayBox> *)&local_15a0;
                        local_6e8 = (FBData<amrex::FArrayBox> *)&local_15a0;
                      }
                      else {
                        local_1968 = (void *)0x0;
                      }
                      local_888 = local_1968;
                      local_39c = iVar14;
                      local_3a0 = uVar2 - local_128c._4_4_;
                      local_3a4 = uVar3;
                      local_86c = local_498;
                      if (local_15e0.p
                          [(long)(iVar14 - local_15e0.begin.x) +
                           (local_3a0 - local_15e0.begin.y) * local_15e0.jstride +
                           (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] ==
                          local_1400._140_4_) {
                        local_86c = local_498 - 1;
                      }
                      local_3b4 = iVar14;
                      local_3b8 = uVar2 + local_128c._4_4_;
                      local_3bc = uVar3;
                      local_870 = local_498;
                      if (local_15e0.p
                          [(long)(iVar14 - local_15e0.begin.x) +
                           (local_3b8 - local_15e0.begin.y) * local_15e0.jstride +
                           (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] ==
                          local_1400._140_4_) {
                        local_870 = local_498 + 1;
                      }
                      local_878.hp = (Array4<const_double> *)&DAT_3ff0000000000000;
                      if (local_870 != local_86c + 1) {
                        local_878.hp = (Array4<const_double> *)0x3fe0000000000000;
                      }
                      local_734 = local_48c;
                      local_73c = local_4a4;
                      local_740 = BVar4 + uVar6;
                      local_74c = local_48c;
                      local_754 = local_4a4;
                      local_758 = BVar4 + uVar6;
                      local_890 = (pointer)((double)local_878.hp *
                                           (*(double *)
                                             (local_15a0 +
                                             ((long)(local_48c - local_1580) +
                                              (int)(local_870 - local_157c) * local_1598 +
                                              (int)(local_4a4 - local_1578) * local_1590 +
                                             local_740 * local_1588) * 8) -
                                           *(double *)
                                            (local_15a0 +
                                            ((long)(local_48c - local_1580) +
                                             (int)(local_86c - local_157c) * local_1598 +
                                             (int)(local_4a4 - local_1578) * local_1590 +
                                            local_758 * local_1588) * 8)));
                      if (local_870 == local_86c + 2) {
                        local_768 = local_498 + 1;
                        local_770 = BVar4 + uVar6;
                        local_764 = local_48c;
                        local_76c = local_4a4;
                        local_788 = BVar4 + uVar6;
                        local_77c = local_48c;
                        local_780 = local_498;
                        local_784 = local_4a4;
                        dVar1 = *(double *)
                                 (local_15a0 +
                                 ((long)(local_48c - local_1580) +
                                  (int)(local_498 - local_157c) * local_1598 +
                                  (int)(local_4a4 - local_1578) * local_1590 +
                                 local_788 * local_1588) * 8);
                        local_798 = local_498 - 1;
                        local_7a0 = BVar4 + uVar6;
                        local_794 = local_48c;
                        local_79c = local_4a4;
                        local_898 = (pointer)(((*(double *)
                                                 (local_15a0 +
                                                 ((long)(local_48c - local_1580) +
                                                  (local_768 - local_157c) * local_1598 +
                                                  (int)(local_4a4 - local_1578) * local_1590 +
                                                 local_770 * local_1588) * 8) - (dVar1 + dVar1)) +
                                              *(double *)
                                               (local_15a0 +
                                               ((long)(local_48c - local_1580) +
                                                (local_798 - local_157c) * local_1598 +
                                                (int)(local_4a4 - local_1578) * local_1590 +
                                               local_7a0 * local_1588) * 8)) * 0.5);
                        local_790 = (FBData<amrex::FArrayBox> *)&local_15a0;
                        local_778 = (FBData<amrex::FArrayBox> *)&local_15a0;
                        local_760 = (FBData<amrex::FArrayBox> *)&local_15a0;
                      }
                      else {
                        local_898 = (pointer)0x0;
                      }
                      local_3cc = iVar14 - (uint)local_128c;
                      local_3d0 = uVar2 - local_128c._4_4_;
                      local_3d4 = uVar3;
                      if (local_15e0.p
                          [(long)(local_3cc - local_15e0.begin.x) +
                           (local_3d0 - local_15e0.begin.y) * local_15e0.jstride +
                           (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] ==
                          local_1400._140_4_) {
                        local_3e4 = iVar14 + (uint)local_128c;
                        local_3e8 = uVar2 - local_128c._4_4_;
                        local_3ec = uVar3;
                        local_3e0 = &local_15e0;
                        if (local_15e0.p
                            [(long)(local_3e4 - local_15e0.begin.x) +
                             (local_3e8 - local_15e0.begin.y) * local_15e0.jstride +
                             (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] !=
                            local_1400._140_4_) goto LAB_018d31e2;
                        local_3fc = iVar14 - (uint)local_128c;
                        local_400 = uVar2 + local_128c._4_4_;
                        local_404 = uVar3;
                        local_3f8 = &local_15e0;
                        if (local_15e0.p
                            [(long)(local_3fc - local_15e0.begin.x) +
                             (local_400 - local_15e0.begin.y) * local_15e0.jstride +
                             (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] !=
                            local_1400._140_4_) goto LAB_018d31e2;
                        local_414 = iVar14 + (uint)local_128c;
                        local_418 = uVar2 + local_128c._4_4_;
                        local_41c = uVar3;
                        local_410 = &local_15e0;
                        if (local_15e0.p
                            [(long)(local_414 - local_15e0.begin.x) +
                             (local_418 - local_15e0.begin.y) * local_15e0.jstride +
                             (int)(uVar3 - local_15e0.begin.z) * local_15e0.kstride] !=
                            local_1400._140_4_) goto LAB_018d31e2;
                        local_7ac = local_48c + 1;
                        local_7b0 = local_498 + 1;
                        local_7b8 = BVar4 + uVar6;
                        local_7b4 = local_4a4;
                        local_7c4 = local_48c + -1;
                        local_7c8 = local_498 + 1;
                        local_7d0 = BVar4 + uVar6;
                        local_7cc = local_4a4;
                        local_7dc = local_48c + -1;
                        local_7e0 = local_498 - 1;
                        local_824.m_bndryReg.m_doihi.vect[1] = BVar4 + uVar6;
                        local_824.m_bndryReg.m_doihi.vect[2] = local_4a4;
                        local_824.m_bndryReg.m_doilo.vect[1] = local_48c + 1;
                        local_824.m_bndryReg.m_doilo.vect[0] = local_498 - 1;
                        local_824.m_bndryReg.m_hishft.vect[1] = BVar4 + uVar6;
                        local_824.m_bndryReg.m_hishft.vect[2] = local_4a4;
                        local_8a0 = (pointer)((((*(double *)
                                                  (local_15a0 +
                                                  ((long)(local_7ac - local_1580) +
                                                   (local_7b0 - local_157c) * local_1598 +
                                                   (int)(local_4a4 - local_1578) * local_1590 +
                                                  local_7b8 * local_1588) * 8) -
                                                *(double *)
                                                 (local_15a0 +
                                                 ((long)(local_7c4 - local_1580) +
                                                  (local_7c8 - local_157c) * local_1598 +
                                                  (int)(local_4a4 - local_1578) * local_1590 +
                                                 local_7d0 * local_1588) * 8)) +
                                               *(double *)
                                                (local_15a0 +
                                                ((long)(local_7dc - local_1580) +
                                                 (local_7e0 - local_157c) * local_1598 +
                                                 (int)(local_4a4 - local_1578) * local_1590 +
                                                local_824.m_bndryReg.m_doihi.vect[1] * local_1588) *
                                                8)) - *(double *)
                                                       (local_15a0 +
                                                       ((long)(local_824.m_bndryReg.m_doilo.vect[1]
                                                              - local_1580) +
                                                        (local_824.m_bndryReg.m_doilo.vect[0] -
                                                        local_157c) * local_1598 +
                                                        (int)(local_4a4 - local_1578) * local_1590 +
                                                       local_824.m_bndryReg.m_hishft.vect[1] *
                                                       local_1588) * 8)) * 0.25);
                        local_824._52_8_ = (FBData<amrex::FArrayBox> *)&local_15a0;
                        local_7d8._M_pi =
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_15a0;
                        local_7c0 = (FBData<amrex::FArrayBox> *)&local_15a0;
                        local_7a8 = (FBData<amrex::FArrayBox> *)&local_15a0;
                      }
                      else {
LAB_018d31e2:
                        local_8a0 = (pointer)0x0;
                      }
                      local_8a8 = ((double)(int)(iVar14 - local_48c * (uint)local_128c) + 0.5) /
                                  (double)(int)(uint)local_128c + -0.5;
                      local_8b0.m_arena =
                           (Arena *)(((double)(int)(uVar2 - local_498 * local_128c._4_4_) + 0.5) /
                                     (double)local_128c._4_4_ + -0.5);
                      local_824.m_bndryReg.m_loshft.vect[1] = local_48c;
                      local_824.m_bndryReg.m_loshft.vect[0] = local_498;
                      local_824.m_bndryReg.m_crse_ratio.vect[2] = local_4a4;
                      local_824.m_bndryReg.m_crse_ratio.vect[1] = BVar4 + uVar6;
                      local_6a4 = iVar14;
                      local_6a8 = uVar2;
                      local_6ac = uVar3;
                      local_6b0 = BVar4 + uVar5;
                      *(double *)
                       (local_1278._0_8_ +
                       ((long)(iVar14 - local_1258) +
                        (long)(int)(uVar2 - local_1254) * local_1278._M_string_length +
                        (long)(int)(uVar3 - local_1250) * local_1278.field_2._M_allocated_capacity +
                       (long)local_6b0 * local_1278.field_2._8_8_) * 8) =
                           local_8a8 * (double)local_8b0.m_arena * (double)local_8a0 +
                           (double)local_8b0.m_arena * (double)local_8b0.m_arena * (double)local_898
                           + (double)local_8b0.m_arena * (double)local_890 +
                             local_8a8 * local_8a8 * (double)local_1968 +
                             local_8a8 * (double)local_880.hp +
                             *(double *)
                              (local_15a0 +
                              ((long)(local_48c - local_1580) +
                               (int)(local_498 - local_157c) * local_1598 +
                               (int)(local_4a4 - local_1578) * local_1590 +
                              local_824.m_bndryReg.m_crse_ratio.vect[1] * local_1588) * 8);
                      local_858 = &local_15e0;
                      local_840._M_t.
                      super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl
                           = (__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
                              )(__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
                                )&local_15a0;
                      local_824._28_8_ = (FBData<amrex::FArrayBox> *)&local_15a0;
                      local_750 = local_86c;
                      local_748 = (FBData<amrex::FArrayBox> *)&local_15a0;
                      local_738 = local_870;
                      local_730 = (FBData<amrex::FArrayBox> *)&local_15a0;
                      local_6d0 = (FBData<amrex::FArrayBox> *)&local_15a0;
                      local_6b8 = (FBData<amrex::FArrayBox> *)&local_15a0;
                      local_6a0 = (FabArray<amrex::FArrayBox> *)
                                  local_830._M_t.
                                  super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                                  .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>
                                  ._M_head_impl;
                      local_3c8 = &local_15e0;
                      local_3b0 = &local_15e0;
                      local_398 = &local_15e0;
                      local_380 = &local_15e0;
                      local_368 = &local_15e0;
                    }
                  }
                }
              }
            }
          }
        }
        else if (local_f68 != 0) {
          Orientation::operator_cast_to_int(&local_11e4);
          local_15e8 = &FabSet::operator[]((FabSet *)
                                           CONCAT44(in_stack_ffffffffffffe654.val,
                                                    in_stack_ffffffffffffe650),(MFIter *)this_01)->
                        super_BaseFab<double>;
          local_15f0 = &FabArray<amrex::FArrayBox>::operator[]
                                  ((FabArray<amrex::FArrayBox> *)
                                   CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650)
                                   ,(MFIter *)this_01)->super_BaseFab<double>;
          local_f48 = local_15e8;
          local_198 = local_15e8->dptr;
          local_1a0 = &local_15e8->domain;
          local_1a4 = local_15e8->nvar;
          local_14c = 0;
          local_178 = (local_1a0->smallend).vect[0];
          local_15c = 1;
          iStack_174 = (local_15e8->domain).smallend.vect[1];
          local_1c0.x = (local_1a0->smallend).vect[0];
          local_1c0.y = (local_1a0->smallend).vect[1];
          local_16c = 2;
          local_1c0.z = (local_15e8->domain).smallend.vect[2];
          local_f8 = &(local_15e8->domain).bigend;
          local_fc = 0;
          local_128 = local_f8->vect[0] + 1;
          local_108 = &(local_15e8->domain).bigend;
          local_10c = 1;
          iStack_124 = (local_15e8->domain).bigend.vect[1] + 1;
          local_118 = &(local_15e8->domain).bigend;
          local_11c = 2;
          local_1e0.z = (local_15e8->domain).bigend.vect[2] + 1;
          local_1e0.y = iStack_124;
          local_1e0.x = local_128;
          local_1d0._0_8_ = local_1e0._0_8_;
          local_1d0.z = local_1e0.z;
          local_1b0._0_8_ = local_1c0._0_8_;
          local_1b0.z = local_1c0.z;
          local_190._0_8_ = local_1c0._0_8_;
          local_190.z = local_1c0.z;
          local_180 = local_1a0;
          local_170 = local_1c0.z;
          local_168 = local_1a0;
          local_158 = local_1a0;
          local_148 = local_1a0;
          local_140._0_8_ = local_1e0._0_8_;
          local_140.z = local_1e0.z;
          local_130 = local_1a0;
          local_120 = local_1e0.z;
          Array4<double>::Array4(&local_1630,local_198,&local_1b0,&local_1d0,local_1a4);
          local_f40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_15f0;
          local_a8 = local_15f0->dptr;
          local_b0 = &local_15f0->domain;
          local_b4 = local_15f0->nvar;
          local_5c = 0;
          local_88 = (local_b0->smallend).vect[0];
          local_6c = 1;
          iStack_84 = (local_15f0->domain).smallend.vect[1];
          local_d0.x = (local_b0->smallend).vect[0];
          local_d0.y = (local_b0->smallend).vect[1];
          local_7c = 2;
          local_d0.z = (local_15f0->domain).smallend.vect[2];
          local_8 = &(local_15f0->domain).bigend;
          local_c = 0;
          local_38 = local_8->vect[0] + 1;
          local_18 = &(local_15f0->domain).bigend;
          local_1c = 1;
          iStack_34 = (local_15f0->domain).bigend.vect[1] + 1;
          local_28 = &(local_15f0->domain).bigend;
          local_2c = 2;
          local_f0.z = (local_15f0->domain).bigend.vect[2] + 1;
          local_f0.y = iStack_34;
          local_f0.x = local_38;
          local_e0._0_8_ = local_f0._0_8_;
          local_e0.z = local_f0.z;
          local_c0._0_8_ = local_d0._0_8_;
          local_c0.z = local_d0.z;
          local_a0._0_8_ = local_d0._0_8_;
          local_a0.z = local_d0.z;
          local_90 = local_b0;
          local_80 = local_d0.z;
          local_78 = local_b0;
          local_68 = local_b0;
          local_58 = local_b0;
          local_50._0_8_ = local_f0._0_8_;
          local_50.z = local_f0.z;
          local_40 = local_b0;
          local_30 = local_f0.z;
          Array4<const_double>::Array4(&local_1670,local_a8,&local_c0,&local_e0,local_b4);
          in_stack_ffffffffffffe660 = (MFIter *)BaseFab<double>::box(local_15e8);
          BaseFab<double>::box(local_15f0);
          in_stack_ffffffffffffe668 = (pointer)local_1694;
          Box::operator&((Box *)CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650),
                         (Box *)this_01);
          local_4bc = 0;
          local_f1c = *(int *)in_stack_ffffffffffffe668;
          local_4cc = 1;
          uStack_f18 = *(uint *)&in_stack_ffffffffffffe668->field_0x4;
          local_f38 = *(element_type **)in_stack_ffffffffffffe668;
          local_4dc = 2;
          local_f30 = (int)in_stack_ffffffffffffe668->_M_string_length;
          local_5a8 = (int *)((long)&in_stack_ffffffffffffe668->_M_string_length + 4);
          local_5ac = 0;
          local_e54 = *local_5a8;
          local_5b8 = (undefined1 *)((long)&in_stack_ffffffffffffe668->_M_string_length + 4);
          local_5bc = 1;
          iStack_e50 = *(int *)&in_stack_ffffffffffffe668->field_2;
          local_e70 = *(pointer *)local_5a8;
          local_5c8 = (undefined1 *)((long)&in_stack_ffffffffffffe668->_M_string_length + 4);
          local_5cc = 2;
          local_e68 = *(int *)((long)&in_stack_ffffffffffffe668->field_2 + 4);
          for (local_16d4 = 0; local_16d8 = local_f30, local_1694._28_8_ = in_stack_ffffffffffffe668
              , local_f28 = in_stack_ffffffffffffe668, local_f14 = local_f30,
              local_e60 = in_stack_ffffffffffffe668, local_e4c = local_e68,
              local_4d8 = in_stack_ffffffffffffe668, local_4c8 = in_stack_ffffffffffffe668,
              local_4b8 = in_stack_ffffffffffffe668, local_16d4 < in_stack_00000008;
              local_16d4 = local_16d4 + 1) {
            for (; local_16dc = uStack_f18, local_16d8 <= local_e68; local_16d8 = local_16d8 + 1) {
              for (; local_16e0 = local_f1c, (int)local_16dc <= iStack_e50;
                  local_16dc = local_16dc + 1) {
                for (; local_16e0 <= local_e54; local_16e0 = local_16e0 + 1) {
                  local_d9c = local_16e0;
                  local_da0 = local_16dc;
                  local_da4 = local_16d8;
                  local_da8 = local_16d4 + local_f6c;
                  local_d98 = &local_1670;
                  local_d84 = local_16e0;
                  local_d88 = local_16dc;
                  local_d8c = local_16d8;
                  local_d90 = local_16d4 + local_f70;
                  local_d80 = &local_1630;
                  local_1630.p
                  [(long)(local_16e0 - local_1630.begin.x) +
                   (int)(local_16dc - local_1630.begin.y) * local_1630.jstride +
                   (local_16d8 - local_1630.begin.z) * local_1630.kstride +
                   local_d90 * local_1630.nstride] =
                       local_1670.p
                       [(long)(local_16e0 - local_1670.begin.x) +
                        (int)(local_16dc - local_1670.begin.y) * local_1670.jstride +
                        (local_16d8 - local_1670.begin.z) * local_1670.kstride +
                        local_da8 * local_1670.nstride];
                }
              }
            }
          }
        }
      }
      MFIter::operator++(&local_11b0);
    }
    MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffe654.val,in_stack_ffffffffffffe650));
    MultiFab::~MultiFab((MultiFab *)0x18d3f46);
  }
  else {
    local_698 = "InterpBndryData::setBndryValues supports only max_order=1 or 3";
    Abort_host((char *)in_stack_ffffffffffffe660);
  }
  return;
}

Assistant:

void
InterpBndryData::BndryValuesDoIt (BndryRegister&  crse,
                                  int             c_start,
                                  const MultiFab* fine,
                                  int             f_start,
                                  int             bnd_start,
                                  int             num_comp,
                                  const IntVect&  ratio,
                                  const BCRec*    bc,
                                  int             max_order)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(fine == nullptr || grids == fine->boxArray());
    //
    // Set bndry types and bclocs.
    //
    if (bc != nullptr) {
        for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
            setBndryConds(*bc, ratio, n);
        }
    }
    //
    // First interpolate from coarse to fine on bndry.
    //
    const Box& fine_domain = geom.Domain();

    //
    // Mask turned off if covered by fine grid.
    //
    if (max_order==3 || max_order==1)
    {
        MultiFab foo(grids,bndry[0].DistributionMap(), 1, 0, MFInfo().SetAlloc(false), FArrayBoxFactory());

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(foo,info); mfi.isValid(); ++mfi)
        {
            BL_ASSERT(grids[mfi.index()] == mfi.validbox());

            const Box& fine_bx  = mfi.validbox();

            for (int i = 0; i < 2*AMREX_SPACEDIM; i++)
            {
                const int               dir  = ((i<AMREX_SPACEDIM) ? i : (i-AMREX_SPACEDIM));
                const Orientation::Side side = ((i<AMREX_SPACEDIM) ? Orientation::low : Orientation::high);

                const Orientation face(dir,side);

                if (fine_bx[face] != fine_domain[face] || geom.isPeriodic(dir))
                {
                    auto const crse_array = crse[face].array(mfi);
                    auto       bdry_array = bndry[face].array(mfi);
                    Box const& b = bndry[face][mfi].box();
                    const auto rr = ratio.dim3();
                    //
                    // Internal or periodic edge, interpolate from crse data.
                    //
                    if (max_order == 1)
                    {
                        AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                        {
                            interpbndrydata_o1(it,jt,kt,n,bdry_array,bnd_start,
                                               crse_array,c_start,rr);
                        });
                    }
                    else
                    {
                        auto const mask_array = masks[face].array(mfi);
                        int is_not_covered = BndryData::not_covered;
                        switch (dir) {
                        case 0:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_x_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM >= 2)
                        case 1:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_y_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM == 3)
                        case 2:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_z_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#endif
#endif
                        default: {}
                        }
                    }
                }
                else if (fine != nullptr)
                {
                    //
                    // Physical bndry, copy from ghost region of corresponding grid
                    //
                    auto& bnd_fab = bndry[face][mfi];
                    auto const& src_fab = (*fine)[mfi];
                    auto bnd_array = bnd_fab.array();
                    auto const src_array = src_fab.array();
                    const Box& b = bnd_fab.box() & src_fab.box();
                    AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, ii, jj, kk, nn,
                    {
                        bnd_array(ii,jj,kk,nn+bnd_start) = src_array(ii,jj,kk,nn+f_start);
                    });
                }
            }
        }
    }
    else
    {
        amrex::Abort("InterpBndryData::setBndryValues supports only max_order=1 or 3");
    }
}